

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3843::ComputeInternalJacobianContIntDamping
          (ChElementHexaANCF_3843 *this,ChMatrixRef *H,double Kfactor,double Rfactor,double Mfactor)

{
  long lVar1;
  Index *scalar;
  Index *scalar_00;
  Matrix<double,__1,__1,_1,__1,__1> *xpr;
  long col;
  long col_00;
  undefined1 *puVar2;
  undefined1 auVar3 [16];
  double dVar4;
  ChElementHexaANCF_3843 *pCVar5;
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
  *pDVar6;
  non_const_type scalar_01;
  undefined8 uVar7;
  Scalar *pSVar8;
  Scalar *pSVar9;
  double *pdVar10;
  int i;
  long lVar11;
  Scalar SVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Matrix<double,__1,__1,_1,__1,__1> Scaled_Combined_PE;
  uint j;
  Matrix<double,__1,__1,_1,__1,__1> PE;
  Matrix<double,__1,__1,_1,__1,__1> DScaled_Combined_PE;
  VectorNIP E1_Block;
  VectorNIP E_BlockDamping;
  VectorNIP E2_Block;
  VectorNIP E3_Block;
  VectorNIP E4_Block;
  VectorNIP SPK2_6_Block;
  VectorNIP SPK2_3_Block;
  VectorNIP SPK2_2_Block;
  VectorNIP SPK2_5_Block;
  VectorNIP SPK2_4_Block;
  VectorNIP E6_Block;
  VectorNIP E5_Block;
  ChVectorN<double,_(NSF_*_(NSF___1))___2> ScaledMassMatrix;
  VectorNIP SPK2_1_Block;
  ChMatrixNMc<double,_3_*_NIP,_3> FCscaled;
  ChMatrixNMc<double,_3_*_NIP,_6> FC;
  ChMatrixNM<double,_NSF,_3_*_NIP> S_scaled_SD;
  MatrixNx6 ebar_ebardot;
  Index IStack_12cb0;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> PStack_12ca0;
  Index *pIStack_12c80;
  element_type *peStack_12c78;
  double *pdStack_12c70;
  ChElementHexaANCF_3843 *pCStack_12c68;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> PStack_12c60;
  Rhs RStack_12c40;
  double *pdStack_12c08;
  Index *pIStack_12c00;
  non_const_type pMStack_12bf8;
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
  *pDStack_12bf0;
  double dStack_12be8;
  undefined1 auStack_12be0 [16];
  scalar_constant_op<double> sStack_12bd0;
  variable_if_dynamic<long,__1> vStack_12bc8;
  variable_if_dynamic<long,__1> vStack_12bc0;
  RhsNested pMStack_12bb8;
  XprTypeNested pMStack_12ba0;
  RhsNested pMStack_12b98;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> PStack_12b80;
  Block<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true> BStack_12b68;
  undefined1 auStack_12b38 [16];
  scalar_constant_op<double> sStack_12b28;
  scalar_constant_op<double> sStack_12b20;
  scalar_constant_op<double> sStack_12b18;
  RhsNested pMStack_12b10;
  variable_if_dynamic<long,__1> vStack_12af8;
  scalar_constant_op<double> sStack_12af0;
  Index *pIStack_12aa0;
  Index *pIStack_12a98;
  non_const_type pMStack_12a90;
  Index *pIStack_12a88;
  Index *pIStack_12a80;
  non_const_type pMStack_12a78;
  Index *pIStack_12a70;
  Index *pIStack_12a68;
  non_const_type pMStack_12a60;
  Index *pIStack_12a58;
  Index *pIStack_12a50;
  non_const_type pMStack_12a48;
  non_const_type pMStack_12a40;
  Index *pIStack_12a38;
  Index *pIStack_12a30;
  non_const_type pMStack_12a28;
  Index *pIStack_12a20;
  Index *pIStack_12a18;
  non_const_type pMStack_12a10;
  Index *pIStack_12a08;
  Index *pIStack_12a00;
  non_const_type pMStack_129f8;
  Index *pIStack_129f0;
  Index *pIStack_129e8;
  non_const_type pMStack_129e0;
  Index *pIStack_129d8;
  Index *pIStack_129d0;
  non_const_type pMStack_129c8;
  Index *pIStack_129c0;
  Index *pIStack_129b8;
  non_const_type pMStack_129b0;
  double dStack_129a8;
  undefined1 auStack_129a0 [16];
  scalar_constant_op<double> sStack_12990;
  scalar_constant_op<double> sStack_12988;
  scalar_constant_op<double> sStack_12980;
  scalar_constant_op<double> sStack_12978;
  variable_if_dynamic<long,__1> vStack_12960;
  scalar_constant_op<double> sStack_12958;
  undefined1 auStack_128c0 [16];
  XprTypeNested pMStack_128b0;
  variable_if_dynamic<long,__1> vStack_128a8;
  variable_if_dynamic<long,__1> vStack_128a0;
  RhsNested pMStack_12898;
  double dStack_12890;
  XprTypeNested pMStack_12888;
  double dStack_12880;
  double dStack_12878;
  double dStack_12870;
  double dStack_12850;
  PointerType pdStack_12848;
  double dStack_12840;
  XprTypeNested pMStack_12838;
  double dStack_12830;
  double dStack_12828;
  RhsNested pMStack_12820;
  double dStack_127f8;
  PointerType pdStack_127f0;
  undefined8 uStack_127e8;
  XprTypeNested pMStack_127e0;
  long lStack_127d8;
  long lStack_127d0;
  Index IStack_127c8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
  CStack_126a8;
  undefined1 auStack_12680 [16];
  scalar_constant_op<double> sStack_12670;
  variable_if_dynamic<long,__1> vStack_12668;
  variable_if_dynamic<long,__1> vStack_12660;
  scalar_constant_op<double> sStack_12658;
  variable_if_dynamic<long,__1> vStack_12650;
  variable_if_dynamic<long,__1> vStack_12648;
  RhsNested pMStack_12640;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
  CStack_12450;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
  CStack_12428;
  undefined1 auStack_12400 [32];
  variable_if_dynamic<long,__1> vStack_123e0;
  XprTypeNested pMStack_123d8;
  variable_if_dynamic<long,__1> vStack_123d0;
  variable_if_dynamic<long,__1> vStack_123c8;
  double dStack_123c0;
  RhsNested pMStack_12200;
  RhsNested pMStack_121f8;
  XprTypeNested pMStack_121f0;
  XprTypeNested pMStack_121e8;
  XprTypeNested pMStack_121e0;
  RhsNested pMStack_121d8;
  RhsNested pMStack_121c0;
  RhsNested pMStack_121b8;
  XprTypeNested pMStack_121b0;
  XprTypeNested pMStack_121a8;
  XprTypeNested pMStack_121a0;
  RhsNested pMStack_12198;
  RhsNested pMStack_12180;
  RhsNested pMStack_12178;
  XprTypeNested pMStack_12170;
  XprTypeNested pMStack_12168;
  XprTypeNested pMStack_12160;
  RhsNested pMStack_12158;
  undefined1 auStack_12140 [40];
  XprTypeNested pMStack_12118;
  variable_if_dynamic<long,__1> vStack_12110;
  variable_if_dynamic<long,__1> vStack_12108;
  RhsNested pMStack_12100;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>
  aCStack_11f40 [6];
  Matrix<double,_64,_1,_0,_64,_1> MStack_11d40;
  Matrix<double,_64,_1,_0,_64,_1> MStack_11b40;
  Matrix<double,_64,_1,_0,_64,_1> MStack_11940;
  undefined1 auStack_11740 [536];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
  CStack_11528;
  Matrix<double,_64,_1,_0,_64,_1> MStack_11500;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>
  aCStack_11300 [6];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>
  aCStack_11100 [6];
  undefined1 auStack_10f00 [16];
  LhsNested LStack_10ef0;
  variable_if_dynamic<long,__1> vStack_10ee8;
  variable_if_dynamic<long,__1> vStack_10ee0;
  XprTypeNested pMStack_10ed8;
  scalar_constant_op<double> sStack_10ed0;
  variable_if_dynamic<long,__1> vStack_10ec8;
  RhsNested pMStack_10ec0;
  LhsNested LStack_10eb0;
  scalar_constant_op<double> sStack_10ea8;
  RhsNested pMStack_10ea0;
  RhsNested pMStack_10e98;
  variable_if_dynamic<long,__1> vStack_10e90;
  variable_if_dynamic<long,__1> vStack_10e88;
  scalar_constant_op<double> sStack_10e80;
  LhsNested LStack_10e68;
  variable_if_dynamic<long,__1> vStack_10e60;
  variable_if_dynamic<long,__1> vStack_10e58;
  XprTypeNested pMStack_10e50;
  scalar_constant_op<double> sStack_10e48;
  variable_if_dynamic<long,__1> vStack_10e40;
  Index IStack_10e38;
  Matrix<double,_64,_1,_0,_64,_1> local_fe80;
  undefined1 local_fc80 [1024];
  Matrix<double,__1,__1,_1,__1,__1> local_f880 [21];
  double local_f680 [64];
  Matrix<double,__1,__1,_1,__1,__1> local_f480 [21];
  Matrix<double,__1,__1,_1,__1,__1> local_f280 [21];
  double local_f080 [64];
  Matrix<double,__1,__1,_1,__1,__1> local_ee80 [21];
  Matrix<double,__1,__1,_1,__1,__1> local_ec80 [21];
  undefined1 local_ea80 [512];
  undefined1 local_e880 [512];
  undefined1 local_e680 [1536];
  Matrix<double,__1,__1,_1,__1,__1> local_e080 [21];
  double local_de80 [64];
  Matrix<double,__1,__1,_1,__1,__1> local_dc80 [21];
  Matrix<double,__1,__1,_1,__1,__1> local_da80 [21];
  undefined1 local_d880 [1024];
  undefined1 local_d480 [3584];
  Matrix<double,_32,_192,_1,_32,_192> local_c680;
  MatrixBase<Eigen::Matrix<double,_32,_6,_1,_32,_6>_> local_680 [1616];
  
  peStack_12c78 = (element_type *)Rfactor;
  pDStack_12bf0 =
       (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        *)H;
  dStack_12be8 = Kfactor;
  dStack_129a8 = Mfactor;
  CalcCombinedCoordMatrix(this,(MatrixNx6 *)local_680);
  xpr = &this->m_SD;
  pCStack_12c68 = this;
  local_fc80._0_8_ = xpr;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array._0_16_ = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>>>::operator*
                           ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>> *)
                            local_fc80,local_680);
  Eigen::PlainObjectBase<Eigen::Matrix<double,192,6,0,192,6>>::
  PlainObjectBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::Matrix<double,32,6,1,32,6>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,192,6,0,192,6>> *)local_ea80,
             (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,_32,_6,_1,_32,_6>,_0>_>
              *)&local_c680);
  PStack_12c60.m_storage.m_cols = 0;
  PStack_12c60.m_storage.m_data = (double *)0x0;
  PStack_12c60.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::resize
            (&PStack_12c60,0x60,0x180);
  IStack_12cb0 = 0;
  lVar11 = 0;
  while( true ) {
    pCVar5 = pCStack_12c68;
    if (lVar11 == 0x20) break;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)local_fc80,xpr,
               lVar11,0);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[6] = (double)local_ea80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)local_fc80._32_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)local_fc80._40_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0] = (double)local_fc80._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[1] = (double)local_fc80._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)local_fc80._16_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)local_fc80._24_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[9] = 0.0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[10] = SUB168(ZEXT816(0),4);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xb] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[8] = local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.
               m_storage.m_data.array[6];
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_10f00,
               (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12c60,IStack_12cb0,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_10f00,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>
                *)&local_c680);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)local_fc80,xpr,
               lVar11,0x40);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[6] = (double)local_e880;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[8] = (double)local_ea80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)local_fc80._32_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)local_fc80._40_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0] = (double)local_fc80._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[1] = (double)local_fc80._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)local_fc80._16_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)local_fc80._24_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[9] = 3.16202013338398e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[10] = 0.0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xb] = 9.48606040015193e-322;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_10f00,
               (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12c60,IStack_12cb0,0x40);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_10f00,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>
                *)&local_c680);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)local_fc80,xpr,
               lVar11,0x80);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[6] = (double)local_e680;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[8] = (double)local_ea80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)local_fc80._32_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)local_fc80._40_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[1] = (double)local_fc80._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0] = (double)local_fc80._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)local_fc80._16_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)local_fc80._24_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[9] = 6.32404026676796e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[10] = 0.0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xb] = 9.48606040015193e-322;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_10f00,
               (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12c60,IStack_12cb0,0x80);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_10f00,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>
                *)&local_c680);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_10f00,xpr,
               lVar11,0x80);
    local_fc80._32_8_ = vStack_10ee0.m_value;
    local_fc80._40_8_ = pMStack_10ed8;
    local_fc80._0_8_ = auStack_10f00._0_8_;
    local_fc80._8_8_ = auStack_10f00._8_8_;
    local_fc80._16_8_ = LStack_10ef0.m_matrix;
    local_fc80._24_8_ = vStack_10ee8.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12680,xpr,
               lVar11,0x40);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[7] = (double)local_e880;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[9] = (double)local_ea80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x12] = (double)vStack_12660.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x13] = sStack_12658.m_other;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xe] = (double)auStack_12680._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xf] = (double)auStack_12680._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x10] = sStack_12670.m_other;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x11] = (double)vStack_12668.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)local_fc80._32_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[6] = (double)local_fc80._40_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[1] = (double)local_fc80._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)local_fc80._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)local_fc80._16_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)local_fc80._24_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x14] = (double)local_e680;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[10] = 3.16202013338398e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xb] = 0.0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xc] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x17] = 6.32404026676796e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x18] = 0.0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x19] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x16] = local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.
                  m_storage.m_data.array[9];
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_128c0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12c60,IStack_12cb0,0xc0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_128c0,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>_>
                *)&local_c680);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_10f00,xpr,
               lVar11,0x80);
    local_fc80._32_8_ = vStack_10ee0.m_value;
    local_fc80._40_8_ = pMStack_10ed8;
    local_fc80._0_8_ = auStack_10f00._0_8_;
    local_fc80._8_8_ = auStack_10f00._8_8_;
    local_fc80._16_8_ = LStack_10ef0.m_matrix;
    local_fc80._24_8_ = vStack_10ee8.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12680,xpr,
               lVar11,0);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[7] = (double)local_ea80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x12] = (double)vStack_12660.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x13] = sStack_12658.m_other;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xe] = (double)auStack_12680._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xf] = (double)auStack_12680._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x10] = sStack_12670.m_other;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x11] = (double)vStack_12668.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)local_fc80._32_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[6] = (double)local_fc80._40_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[1] = (double)local_fc80._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)local_fc80._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)local_fc80._16_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)local_fc80._24_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[10] = 0.0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xb] = SUB168(ZEXT816(0),4);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x14] = (double)local_e680;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xc] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x17] = 6.32404026676796e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x18] = 0.0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x19] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[9] = local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.
               m_storage.m_data.array[7];
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x16] = local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.
                  m_storage.m_data.array[7];
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_128c0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12c60,IStack_12cb0,0x100);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_128c0,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>_>
                *)&local_c680);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_10f00,xpr,
               lVar11,0x40);
    local_fc80._32_8_ = vStack_10ee0.m_value;
    local_fc80._40_8_ = pMStack_10ed8;
    local_fc80._0_8_ = auStack_10f00._0_8_;
    local_fc80._8_8_ = auStack_10f00._8_8_;
    local_fc80._16_8_ = LStack_10ef0.m_matrix;
    local_fc80._24_8_ = vStack_10ee8.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12680,xpr,
               lVar11,0);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[7] = (double)local_ea80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x12] = (double)vStack_12660.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x13] = sStack_12658.m_other;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xe] = (double)auStack_12680._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xf] = (double)auStack_12680._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x10] = sStack_12670.m_other;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x11] = (double)vStack_12668.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)local_fc80._32_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[6] = (double)local_fc80._40_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[1] = (double)local_fc80._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)local_fc80._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)local_fc80._16_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)local_fc80._24_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[10] = 0.0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xb] = SUB168(ZEXT816(0),4);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x14] = (double)local_e880;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xc] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x17] = 3.16202013338398e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x18] = 0.0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x19] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[9] = local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.
               m_storage.m_data.array[7];
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x16] = local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.
                  m_storage.m_data.array[7];
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_128c0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12c60,IStack_12cb0,0x140);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_128c0,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>_>
                *)&local_c680);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)local_fc80,xpr,
               lVar11,0);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[6] = (double)(local_e680 + 0x200);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[8] = (double)local_ea80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)local_fc80._32_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)local_fc80._40_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0] = (double)local_fc80._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[1] = (double)local_fc80._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)local_fc80._16_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)local_fc80._24_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[9] = 0.0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[10] = 4.94065645841247e-324;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xb] = 9.48606040015193e-322;
    lVar1 = IStack_12cb0 + 1;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_10f00,
               (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12c60,lVar1,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_10f00,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>
                *)&local_c680);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)local_fc80,xpr,
               lVar11,0x40);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[6] = (double)(local_e680 + 0x400);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[8] = (double)local_ea80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)local_fc80._32_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)local_fc80._40_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0] = (double)local_fc80._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[1] = (double)local_fc80._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)local_fc80._16_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)local_fc80._24_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[9] = 3.16202013338398e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[10] = 4.94065645841247e-324;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xb] = 9.48606040015193e-322;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_10f00,
               (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12c60,lVar1,0x40);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_10f00,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>
                *)&local_c680);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)local_fc80,xpr,
               lVar11,0x80);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[6] = (double)local_e080;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[8] = (double)local_ea80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)local_fc80._32_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)local_fc80._40_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[1] = (double)local_fc80._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0] = (double)local_fc80._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)local_fc80._16_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)local_fc80._24_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[9] = 6.32404026676796e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[10] = 4.94065645841247e-324;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xb] = 9.48606040015193e-322;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_10f00,
               (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12c60,lVar1,0x80);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_10f00,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>
                *)&local_c680);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_10f00,xpr,
               lVar11,0x80);
    local_fc80._32_8_ = vStack_10ee0.m_value;
    local_fc80._40_8_ = pMStack_10ed8;
    local_fc80._0_8_ = auStack_10f00._0_8_;
    local_fc80._8_8_ = auStack_10f00._8_8_;
    local_fc80._16_8_ = LStack_10ef0.m_matrix;
    local_fc80._24_8_ = vStack_10ee8.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12680,xpr,
               lVar11,0x40);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[7] = (double)(local_e680 + 0x400);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x12] = (double)vStack_12660.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x13] = sStack_12658.m_other;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xe] = (double)auStack_12680._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xf] = (double)auStack_12680._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x10] = sStack_12670.m_other;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x11] = (double)vStack_12668.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)local_fc80._32_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[6] = (double)local_fc80._40_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[1] = (double)local_fc80._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)local_fc80._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)local_fc80._16_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)local_fc80._24_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[9] = (double)local_ea80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[10] = 3.16202013338398e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x14] = (double)local_e080;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xb] = 4.94065645841247e-324;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xc] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x17] = 6.32404026676796e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x18] = 4.94065645841247e-324;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x19] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x16] = local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.
                  m_storage.m_data.array[9];
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_128c0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12c60,lVar1,0xc0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_128c0,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>_>
                *)&local_c680);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_10f00,xpr,
               lVar11,0x80);
    local_fc80._32_8_ = vStack_10ee0.m_value;
    local_fc80._40_8_ = pMStack_10ed8;
    local_fc80._0_8_ = auStack_10f00._0_8_;
    local_fc80._8_8_ = auStack_10f00._8_8_;
    local_fc80._16_8_ = LStack_10ef0.m_matrix;
    local_fc80._24_8_ = vStack_10ee8.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12680,xpr,
               lVar11,0);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[7] = (double)(local_e680 + 0x200);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x12] = (double)vStack_12660.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x13] = sStack_12658.m_other;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xe] = (double)auStack_12680._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xf] = (double)auStack_12680._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x10] = sStack_12670.m_other;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x11] = (double)vStack_12668.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)local_fc80._32_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[6] = (double)local_fc80._40_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[1] = (double)local_fc80._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)local_fc80._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)local_fc80._16_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)local_fc80._24_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[9] = (double)local_ea80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[10] = 0.0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x14] = (double)local_e080;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xb] = 4.94065645841247e-324;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xc] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x17] = 6.32404026676796e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x18] = 4.94065645841247e-324;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x19] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x16] = local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.
                  m_storage.m_data.array[9];
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_128c0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12c60,lVar1,0x100);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_128c0,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>_>
                *)&local_c680);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_10f00,xpr,
               lVar11,0x40);
    local_fc80._32_8_ = vStack_10ee0.m_value;
    local_fc80._40_8_ = pMStack_10ed8;
    local_fc80._0_8_ = auStack_10f00._0_8_;
    local_fc80._8_8_ = auStack_10f00._8_8_;
    local_fc80._16_8_ = LStack_10ef0.m_matrix;
    local_fc80._24_8_ = vStack_10ee8.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12680,xpr,
               lVar11,0);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[7] = (double)(local_e680 + 0x200);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x12] = (double)vStack_12660.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x13] = sStack_12658.m_other;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xe] = (double)auStack_12680._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xf] = (double)auStack_12680._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x10] = sStack_12670.m_other;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x11] = (double)vStack_12668.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)local_fc80._32_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[6] = (double)local_fc80._40_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[1] = (double)local_fc80._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)local_fc80._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)local_fc80._16_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)local_fc80._24_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[9] = (double)local_ea80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[10] = 0.0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x14] = (double)(local_e680 + 0x400);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xb] = 4.94065645841247e-324;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xc] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x17] = 3.16202013338398e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x18] = 4.94065645841247e-324;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x19] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x16] = local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.
                  m_storage.m_data.array[9];
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_128c0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12c60,lVar1,0x140);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_128c0,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>_>
                *)&local_c680);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)local_fc80,xpr,
               lVar11,0);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[6] = (double)local_de80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[8] = (double)local_ea80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)local_fc80._32_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)local_fc80._40_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0] = (double)local_fc80._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[1] = (double)local_fc80._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)local_fc80._16_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)local_fc80._24_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[9] = 0.0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[10] = 9.88131291682493e-324;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xb] = 9.48606040015193e-322;
    lVar1 = IStack_12cb0 + 2;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_10f00,
               (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12c60,lVar1,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_10f00,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>
                *)&local_c680);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)local_fc80,xpr,
               lVar11,0x40);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[6] = (double)local_dc80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[8] = (double)local_ea80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)local_fc80._32_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)local_fc80._40_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0] = (double)local_fc80._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[1] = (double)local_fc80._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)local_fc80._16_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)local_fc80._24_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[9] = 3.16202013338398e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[10] = 9.88131291682493e-324;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xb] = 9.48606040015193e-322;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_10f00,
               (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12c60,lVar1,0x40);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_10f00,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>
                *)&local_c680);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)local_fc80,xpr,
               lVar11,0x80);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[6] = (double)local_da80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[8] = (double)local_ea80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)local_fc80._32_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)local_fc80._40_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[1] = (double)local_fc80._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0] = (double)local_fc80._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)local_fc80._16_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)local_fc80._24_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[9] = 6.32404026676796e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[10] = 9.88131291682493e-324;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xb] = 9.48606040015193e-322;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_10f00,
               (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12c60,lVar1,0x80);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_10f00,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>
                *)&local_c680);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_10f00,xpr,
               lVar11,0x80);
    local_fc80._32_8_ = vStack_10ee0.m_value;
    local_fc80._40_8_ = pMStack_10ed8;
    local_fc80._0_8_ = auStack_10f00._0_8_;
    local_fc80._8_8_ = auStack_10f00._8_8_;
    local_fc80._16_8_ = LStack_10ef0.m_matrix;
    local_fc80._24_8_ = vStack_10ee8.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12680,xpr,
               lVar11,0x40);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[7] = (double)local_dc80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x12] = (double)vStack_12660.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x13] = sStack_12658.m_other;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xe] = (double)auStack_12680._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xf] = (double)auStack_12680._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x10] = sStack_12670.m_other;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x11] = (double)vStack_12668.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)local_fc80._32_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[6] = (double)local_fc80._40_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[1] = (double)local_fc80._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)local_fc80._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)local_fc80._16_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)local_fc80._24_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[9] = (double)local_ea80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[10] = 3.16202013338398e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x14] = (double)local_da80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xb] = 9.88131291682493e-324;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xc] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x17] = 6.32404026676796e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x18] = 9.88131291682493e-324;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x19] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x16] = local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.
                  m_storage.m_data.array[9];
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_128c0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12c60,lVar1,0xc0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_128c0,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>_>
                *)&local_c680);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_10f00,xpr,
               lVar11,0x80);
    local_fc80._32_8_ = vStack_10ee0.m_value;
    local_fc80._40_8_ = pMStack_10ed8;
    local_fc80._0_8_ = auStack_10f00._0_8_;
    local_fc80._8_8_ = auStack_10f00._8_8_;
    local_fc80._16_8_ = LStack_10ef0.m_matrix;
    local_fc80._24_8_ = vStack_10ee8.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12680,xpr,
               lVar11,0);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[7] = (double)local_de80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x12] = (double)vStack_12660.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x13] = sStack_12658.m_other;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xe] = (double)auStack_12680._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xf] = (double)auStack_12680._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x10] = sStack_12670.m_other;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x11] = (double)vStack_12668.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)local_fc80._32_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[6] = (double)local_fc80._40_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[1] = (double)local_fc80._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)local_fc80._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)local_fc80._16_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)local_fc80._24_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[9] = (double)local_ea80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[10] = 0.0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x14] = (double)local_da80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xb] = 9.88131291682493e-324;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xc] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x17] = 6.32404026676796e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x18] = 9.88131291682493e-324;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x19] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x16] = local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.
                  m_storage.m_data.array[9];
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_128c0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12c60,lVar1,0x100);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_128c0,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>_>
                *)&local_c680);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_10f00,xpr,
               lVar11,0x40);
    local_fc80._32_8_ = vStack_10ee0.m_value;
    local_fc80._40_8_ = pMStack_10ed8;
    local_fc80._0_8_ = auStack_10f00._0_8_;
    local_fc80._8_8_ = auStack_10f00._8_8_;
    local_fc80._16_8_ = LStack_10ef0.m_matrix;
    local_fc80._24_8_ = vStack_10ee8.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12680,xpr,
               lVar11,0);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[7] = (double)local_de80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x12] = (double)vStack_12660.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x13] = sStack_12658.m_other;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xe] = (double)auStack_12680._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xf] = (double)auStack_12680._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x10] = sStack_12670.m_other;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x11] = (double)vStack_12668.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)local_fc80._32_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[6] = (double)local_fc80._40_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[1] = (double)local_fc80._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)local_fc80._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)local_fc80._16_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)local_fc80._24_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[9] = (double)local_ea80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[10] = 0.0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x14] = (double)local_dc80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xb] = 9.88131291682493e-324;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xc] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x17] = 3.16202013338398e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x18] = 9.88131291682493e-324;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x19] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x16] = local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.
                  m_storage.m_data.array[9];
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_128c0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12c60,lVar1,0x140);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_128c0,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>_>
                *)&local_c680);
    IStack_12cb0 = IStack_12cb0 + 3;
    lVar11 = lVar11 + 1;
  }
  auVar14._8_8_ = 0;
  auVar14._0_8_ = peStack_12c78;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = pCStack_12c68->m_Alpha;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = dStack_12be8;
  auVar3 = vfmadd213sd_fma(auVar14,auVar13,auVar3);
  vStack_128a8.m_value = 0;
  vStack_128a0.m_value = 0;
  pMStack_12898 = (RhsNested)0xc0;
  auStack_12140._0_8_ = auVar3._0_8_;
  auStack_128c0._0_8_ = (XprTypeNested)local_ea80;
  pMStack_128b0 = (XprTypeNested)local_ea80;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_192,_3,_0,_192,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_192,_3,_false>_>
                    *)auStack_10f00,(double *)auStack_12140,(StorageBaseType *)auStack_128c0);
  pdStack_12c70 = &pCVar5->m_Alpha;
  auStack_12400._0_8_ = local_d880;
  aCStack_11f40[0]._0_8_ = *pdStack_12c70 * dStack_12be8;
  auStack_12400._24_8_ = 0;
  vStack_123e0.m_value = 3;
  pMStack_123d8 = (XprTypeNested)0xc0;
  auStack_12400._16_8_ = (XprTypeNested)local_ea80;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_192,_3,_0,_192,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_192,_3,_false>_>
                    *)auStack_12680,(double *)aCStack_11f40,(StorageBaseType *)auStack_12400);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[3] = (double)LStack_10ef0.m_matrix;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[4] = (double)vStack_10ee8.m_value;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[5] = (double)vStack_10ee0.m_value;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[6] = (double)pMStack_10ed8;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[7] = sStack_10ed0.m_other;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[8] = (double)vStack_10ec8.m_value;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[9] = (double)pMStack_10ec0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xd] = sStack_12670.m_other;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xe] = (double)vStack_12668.m_value;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xf] = (double)vStack_12660.m_value;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x10] = sStack_12658.m_other;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x11] = (double)vStack_12650.m_value;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x12] = (double)vStack_12648.m_value;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x13] = (double)pMStack_12640;
  Eigen::PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,192,3,0,192,3>const>const,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,192,3,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,192,3,0,192,3>const>const,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,192,3,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,192,3,0,192,3>> *)local_fc80,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_192,_3,_0,_192,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_192,_3,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_192,_3,_0,_192,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_192,_3,_false>_>_>_>
              *)&local_c680);
  lVar11 = 0;
  peStack_12c78 = (element_type *)&pCStack_12c68->m_kGQ;
  while( true ) {
    if (lVar11 == 3) break;
    auStack_12680._0_8_ = peStack_12c78;
    Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>::Block
              ((Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false> *)auStack_10f00,
               (Matrix<double,_192,_3,_0,_192,_3> *)local_fc80,0,lVar11);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)vStack_10ee0.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)pMStack_10ed8;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)LStack_10ef0.m_matrix;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)vStack_10ee8.m_value;
    Eigen::
    ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>>>::
    operator*=((ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>>>
                *)&local_c680,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
               auStack_12680);
    auStack_12680._0_8_ = peStack_12c78;
    Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>::Block
              ((Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false> *)auStack_10f00,
               (Matrix<double,_192,_3,_0,_192,_3> *)local_fc80,0x40,lVar11);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)vStack_10ee0.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)pMStack_10ed8;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)LStack_10ef0.m_matrix;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)vStack_10ee8.m_value;
    Eigen::
    ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>>>::
    operator*=((ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>>>
                *)&local_c680,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
               auStack_12680);
    auStack_12680._0_8_ = peStack_12c78;
    Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>::Block
              ((Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false> *)auStack_10f00,
               (Matrix<double,_192,_3,_0,_192,_3> *)local_fc80,0x80,lVar11);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)vStack_10ee0.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)pMStack_10ed8;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[1] = (double)auStack_10f00._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0] = (double)auStack_10f00._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)LStack_10ef0.m_matrix;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)vStack_10ee8.m_value;
    Eigen::
    ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>>>::
    operator*=((ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>>>
                *)&local_c680,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
               auStack_12680);
    lVar11 = lVar11 + 1;
  }
  PStack_12ca0.m_storage.m_cols = 0;
  PStack_12ca0.m_storage.m_data = (double *)0x0;
  PStack_12ca0.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::resize
            (&PStack_12ca0,0x60,0x180);
  lVar11 = 0;
  IStack_12cb0 = 0;
  while( true ) {
    pDVar6 = pDStack_12bf0;
    if (lVar11 == 0x20) break;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_10f00,xpr,
               lVar11,0);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[6] = (double)local_fc80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)vStack_10ee0.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)pMStack_10ed8;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0] = (double)auStack_10f00._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[1] = (double)auStack_10f00._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)LStack_10ef0.m_matrix;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)vStack_10ee8.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[9] = 0.0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[10] = 0.0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xb] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[8] = local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.
               m_storage.m_data.array[6];
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12680,
               (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,IStack_12cb0,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12680,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>
                *)&local_c680);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_10f00,xpr,
               lVar11,0x40);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[6] = (double)(local_fc80 + 0x200);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[8] = (double)local_fc80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)vStack_10ee0.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)pMStack_10ed8;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0] = (double)auStack_10f00._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[1] = (double)auStack_10f00._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)LStack_10ef0.m_matrix;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)vStack_10ee8.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[9] = 3.16202013338398e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[10] = 0.0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xb] = 9.48606040015193e-322;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12680,
               (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,IStack_12cb0,0x40);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12680,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>
                *)&local_c680);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_10f00,xpr,
               lVar11,0x80);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[6] = (double)local_f880;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[8] = (double)local_fc80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)vStack_10ee0.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)pMStack_10ed8;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[1] = (double)auStack_10f00._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0] = (double)auStack_10f00._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)LStack_10ef0.m_matrix;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)vStack_10ee8.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[9] = 6.32404026676796e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[10] = 0.0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xb] = 9.48606040015193e-322;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12680,
               (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,IStack_12cb0,0x80);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12680,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>
                *)&local_c680);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12680,xpr,
               lVar11,0x80);
    vStack_10ee0.m_value = vStack_12660.m_value;
    pMStack_10ed8 = (XprTypeNested)sStack_12658.m_other;
    auStack_10f00._0_8_ = auStack_12680._0_8_;
    auStack_10f00._8_8_ = auStack_12680._8_8_;
    LStack_10ef0.m_matrix = (non_const_type)sStack_12670.m_other;
    vStack_10ee8.m_value = vStack_12668.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_128c0,xpr,
               lVar11,0x40);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[7] = (double)(local_fc80 + 0x200);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x14] = (double)local_f880;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x12] = (double)vStack_128a0.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x13] = (double)pMStack_12898;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xe] = (double)auStack_128c0._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xf] = (double)auStack_128c0._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x10] = (double)pMStack_128b0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x11] = (double)vStack_128a8.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)vStack_10ee0.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[6] = (double)pMStack_10ed8;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[1] = (double)auStack_10f00._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)auStack_10f00._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)LStack_10ef0.m_matrix;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)vStack_10ee8.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[9] = (double)local_fc80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[10] = 3.16202013338398e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xb] = 0.0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xc] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x17] = 6.32404026676796e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x18] = 0.0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x19] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x16] = local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.
                  m_storage.m_data.array[9];
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12400,
               (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,IStack_12cb0,0xc0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12400,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>_>
                *)&local_c680);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12680,xpr,
               lVar11,0x80);
    vStack_10ee0.m_value = vStack_12660.m_value;
    pMStack_10ed8 = (XprTypeNested)sStack_12658.m_other;
    auStack_10f00._0_8_ = auStack_12680._0_8_;
    auStack_10f00._8_8_ = auStack_12680._8_8_;
    LStack_10ef0.m_matrix = (non_const_type)sStack_12670.m_other;
    vStack_10ee8.m_value = vStack_12668.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_128c0,xpr,
               lVar11,0);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[7] = (double)local_fc80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x14] = (double)local_f880;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x12] = (double)vStack_128a0.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x13] = (double)pMStack_12898;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xe] = (double)auStack_128c0._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xf] = (double)auStack_128c0._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x10] = (double)pMStack_128b0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x11] = (double)vStack_128a8.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)vStack_10ee0.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[6] = (double)pMStack_10ed8;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[1] = (double)auStack_10f00._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)auStack_10f00._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)LStack_10ef0.m_matrix;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)vStack_10ee8.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[10] = 0.0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xb] = 0.0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xc] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x17] = 6.32404026676796e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x18] = 0.0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x19] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[9] = local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.
               m_storage.m_data.array[7];
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x16] = local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.
                  m_storage.m_data.array[7];
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12400,
               (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,IStack_12cb0,0x100);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12400,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>_>
                *)&local_c680);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12680,xpr,
               lVar11,0x40);
    vStack_10ee0.m_value = vStack_12660.m_value;
    pMStack_10ed8 = (XprTypeNested)sStack_12658.m_other;
    auStack_10f00._0_8_ = auStack_12680._0_8_;
    auStack_10f00._8_8_ = auStack_12680._8_8_;
    LStack_10ef0.m_matrix = (non_const_type)sStack_12670.m_other;
    vStack_10ee8.m_value = vStack_12668.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_128c0,xpr,
               lVar11,0);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[7] = (double)local_fc80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x14] = (double)(local_fc80 + 0x200);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x12] = (double)vStack_128a0.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x13] = (double)pMStack_12898;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xe] = (double)auStack_128c0._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xf] = (double)auStack_128c0._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x10] = (double)pMStack_128b0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x11] = (double)vStack_128a8.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)vStack_10ee0.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[6] = (double)pMStack_10ed8;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[1] = (double)auStack_10f00._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)auStack_10f00._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)LStack_10ef0.m_matrix;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)vStack_10ee8.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[10] = 0.0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xb] = 0.0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xc] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x17] = 3.16202013338398e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x18] = 0.0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x19] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[9] = local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.
               m_storage.m_data.array[7];
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x16] = local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.
                  m_storage.m_data.array[7];
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12400,
               (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,IStack_12cb0,0x140);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12400,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>_>
                *)&local_c680);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_10f00,xpr,
               lVar11,0);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[6] = (double)local_f680;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[8] = (double)local_fc80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)vStack_10ee0.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)pMStack_10ed8;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0] = (double)auStack_10f00._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[1] = (double)auStack_10f00._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)LStack_10ef0.m_matrix;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)vStack_10ee8.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[9] = 0.0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[10] = 4.94065645841247e-324;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xb] = 9.48606040015193e-322;
    lVar1 = IStack_12cb0 + 1;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12680,
               (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,lVar1,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12680,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>
                *)&local_c680);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_10f00,xpr,
               lVar11,0x40);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[6] = (double)local_f480;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[8] = (double)local_fc80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)vStack_10ee0.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)pMStack_10ed8;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0] = (double)auStack_10f00._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[1] = (double)auStack_10f00._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)LStack_10ef0.m_matrix;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)vStack_10ee8.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[9] = 3.16202013338398e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[10] = 4.94065645841247e-324;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xb] = 9.48606040015193e-322;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12680,
               (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,lVar1,0x40);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12680,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>
                *)&local_c680);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_10f00,xpr,
               lVar11,0x80);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[6] = (double)local_f280;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[8] = (double)local_fc80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)vStack_10ee0.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)pMStack_10ed8;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[1] = (double)auStack_10f00._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0] = (double)auStack_10f00._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)LStack_10ef0.m_matrix;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)vStack_10ee8.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[9] = 6.32404026676796e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[10] = 4.94065645841247e-324;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xb] = 9.48606040015193e-322;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12680,
               (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,lVar1,0x80);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12680,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>
                *)&local_c680);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12680,xpr,
               lVar11,0x80);
    vStack_10ee0.m_value = vStack_12660.m_value;
    pMStack_10ed8 = (XprTypeNested)sStack_12658.m_other;
    auStack_10f00._0_8_ = auStack_12680._0_8_;
    auStack_10f00._8_8_ = auStack_12680._8_8_;
    LStack_10ef0.m_matrix = (non_const_type)sStack_12670.m_other;
    vStack_10ee8.m_value = vStack_12668.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_128c0,xpr,
               lVar11,0x40);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[7] = (double)local_f480;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x12] = (double)vStack_128a0.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x13] = (double)pMStack_12898;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xe] = (double)auStack_128c0._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xf] = (double)auStack_128c0._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x10] = (double)pMStack_128b0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x11] = (double)vStack_128a8.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)vStack_10ee0.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[6] = (double)pMStack_10ed8;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[1] = (double)auStack_10f00._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)auStack_10f00._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)LStack_10ef0.m_matrix;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)vStack_10ee8.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[9] = (double)local_fc80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[10] = 3.16202013338398e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x14] = (double)local_f280;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xb] = 4.94065645841247e-324;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xc] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x17] = 6.32404026676796e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x18] = 4.94065645841247e-324;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x19] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x16] = local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.
                  m_storage.m_data.array[9];
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12400,
               (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,lVar1,0xc0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12400,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>_>
                *)&local_c680);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12680,xpr,
               lVar11,0x80);
    vStack_10ee0.m_value = vStack_12660.m_value;
    pMStack_10ed8 = (XprTypeNested)sStack_12658.m_other;
    auStack_10f00._0_8_ = auStack_12680._0_8_;
    auStack_10f00._8_8_ = auStack_12680._8_8_;
    LStack_10ef0.m_matrix = (non_const_type)sStack_12670.m_other;
    vStack_10ee8.m_value = vStack_12668.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_128c0,xpr,
               lVar11,0);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[7] = (double)local_f680;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x12] = (double)vStack_128a0.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x13] = (double)pMStack_12898;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xe] = (double)auStack_128c0._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xf] = (double)auStack_128c0._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x10] = (double)pMStack_128b0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x11] = (double)vStack_128a8.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)vStack_10ee0.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[6] = (double)pMStack_10ed8;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[1] = (double)auStack_10f00._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)auStack_10f00._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)LStack_10ef0.m_matrix;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)vStack_10ee8.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[9] = (double)local_fc80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[10] = 0.0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x14] = (double)local_f280;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xb] = 4.94065645841247e-324;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xc] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x17] = 6.32404026676796e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x18] = 4.94065645841247e-324;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x19] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x16] = local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.
                  m_storage.m_data.array[9];
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12400,
               (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,lVar1,0x100);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12400,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>_>
                *)&local_c680);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12680,xpr,
               lVar11,0x40);
    vStack_10ee0.m_value = vStack_12660.m_value;
    pMStack_10ed8 = (XprTypeNested)sStack_12658.m_other;
    auStack_10f00._0_8_ = auStack_12680._0_8_;
    auStack_10f00._8_8_ = auStack_12680._8_8_;
    LStack_10ef0.m_matrix = (non_const_type)sStack_12670.m_other;
    vStack_10ee8.m_value = vStack_12668.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_128c0,xpr,
               lVar11,0);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[7] = (double)local_f680;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x12] = (double)vStack_128a0.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x13] = (double)pMStack_12898;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xe] = (double)auStack_128c0._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xf] = (double)auStack_128c0._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x10] = (double)pMStack_128b0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x11] = (double)vStack_128a8.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)vStack_10ee0.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[6] = (double)pMStack_10ed8;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[1] = (double)auStack_10f00._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)auStack_10f00._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)LStack_10ef0.m_matrix;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)vStack_10ee8.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[9] = (double)local_fc80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[10] = 0.0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x14] = (double)local_f480;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xb] = 4.94065645841247e-324;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xc] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x17] = 3.16202013338398e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x18] = 4.94065645841247e-324;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x19] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x16] = local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.
                  m_storage.m_data.array[9];
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12400,
               (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,lVar1,0x140);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12400,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>_>
                *)&local_c680);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_10f00,xpr,
               lVar11,0);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[6] = (double)local_f080;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[8] = (double)local_fc80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)vStack_10ee0.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)pMStack_10ed8;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0] = (double)auStack_10f00._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[1] = (double)auStack_10f00._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)LStack_10ef0.m_matrix;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)vStack_10ee8.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[9] = 0.0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[10] = 9.88131291682493e-324;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xb] = 9.48606040015193e-322;
    lVar1 = IStack_12cb0 + 2;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12680,
               (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,lVar1,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12680,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>
                *)&local_c680);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_10f00,xpr,
               lVar11,0x40);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[6] = (double)local_ee80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[8] = (double)local_fc80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)vStack_10ee0.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)pMStack_10ed8;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0] = (double)auStack_10f00._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[1] = (double)auStack_10f00._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)LStack_10ef0.m_matrix;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)vStack_10ee8.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[9] = 3.16202013338398e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[10] = 9.88131291682493e-324;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xb] = 9.48606040015193e-322;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12680,
               (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,lVar1,0x40);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12680,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>
                *)&local_c680);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_10f00,xpr,
               lVar11,0x80);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[6] = (double)local_ec80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[8] = (double)local_fc80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)vStack_10ee0.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)pMStack_10ed8;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[1] = (double)auStack_10f00._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0] = (double)auStack_10f00._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)LStack_10ef0.m_matrix;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)vStack_10ee8.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[9] = 6.32404026676796e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[10] = 9.88131291682493e-324;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xb] = 9.48606040015193e-322;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12680,
               (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,lVar1,0x80);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12680,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>
                *)&local_c680);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12680,xpr,
               lVar11,0x80);
    vStack_10ee0.m_value = vStack_12660.m_value;
    pMStack_10ed8 = (XprTypeNested)sStack_12658.m_other;
    auStack_10f00._0_8_ = auStack_12680._0_8_;
    auStack_10f00._8_8_ = auStack_12680._8_8_;
    LStack_10ef0.m_matrix = (non_const_type)sStack_12670.m_other;
    vStack_10ee8.m_value = vStack_12668.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_128c0,xpr,
               lVar11,0x40);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[7] = (double)local_ee80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x12] = (double)vStack_128a0.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x13] = (double)pMStack_12898;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xe] = (double)auStack_128c0._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xf] = (double)auStack_128c0._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x10] = (double)pMStack_128b0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x11] = (double)vStack_128a8.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)vStack_10ee0.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[6] = (double)pMStack_10ed8;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[1] = (double)auStack_10f00._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)auStack_10f00._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)LStack_10ef0.m_matrix;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)vStack_10ee8.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[9] = (double)local_fc80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[10] = 3.16202013338398e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x14] = (double)local_ec80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xb] = 9.88131291682493e-324;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xc] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x17] = 6.32404026676796e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x18] = 9.88131291682493e-324;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x19] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x16] = local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.
                  m_storage.m_data.array[9];
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12400,
               (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,lVar1,0xc0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12400,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>_>
                *)&local_c680);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12680,xpr,
               lVar11,0x80);
    vStack_10ee0.m_value = vStack_12660.m_value;
    pMStack_10ed8 = (XprTypeNested)sStack_12658.m_other;
    auStack_10f00._0_8_ = auStack_12680._0_8_;
    auStack_10f00._8_8_ = auStack_12680._8_8_;
    LStack_10ef0.m_matrix = (non_const_type)sStack_12670.m_other;
    vStack_10ee8.m_value = vStack_12668.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_128c0,xpr,
               lVar11,0);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[7] = (double)local_f080;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x12] = (double)vStack_128a0.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x13] = (double)pMStack_12898;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xe] = (double)auStack_128c0._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xf] = (double)auStack_128c0._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x10] = (double)pMStack_128b0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x11] = (double)vStack_128a8.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)vStack_10ee0.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[6] = (double)pMStack_10ed8;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[1] = (double)auStack_10f00._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)auStack_10f00._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)LStack_10ef0.m_matrix;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)vStack_10ee8.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[9] = (double)local_fc80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[10] = 0.0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x14] = (double)local_ec80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xb] = 9.88131291682493e-324;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xc] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x17] = 6.32404026676796e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x18] = 9.88131291682493e-324;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x19] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x16] = local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.
                  m_storage.m_data.array[9];
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12400,
               (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,lVar1,0x100);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12400,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>_>
                *)&local_c680);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12680,xpr,
               lVar11,0x40);
    vStack_10ee0.m_value = vStack_12660.m_value;
    pMStack_10ed8 = (XprTypeNested)sStack_12658.m_other;
    auStack_10f00._0_8_ = auStack_12680._0_8_;
    auStack_10f00._8_8_ = auStack_12680._8_8_;
    LStack_10ef0.m_matrix = (non_const_type)sStack_12670.m_other;
    vStack_10ee8.m_value = vStack_12668.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_128c0,xpr,
               lVar11,0);
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[7] = (double)local_f080;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x12] = (double)vStack_128a0.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x13] = (double)pMStack_12898;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xe] = (double)auStack_128c0._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xf] = (double)auStack_128c0._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x10] = (double)pMStack_128b0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x11] = (double)vStack_128a8.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[5] = (double)vStack_10ee0.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[6] = (double)pMStack_10ed8;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[1] = (double)auStack_10f00._0_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[2] = (double)auStack_10f00._8_8_;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[3] = (double)LStack_10ef0.m_matrix;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[4] = (double)vStack_10ee8.m_value;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[9] = (double)local_fc80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[10] = 0.0;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x14] = (double)local_ee80;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xb] = 9.88131291682493e-324;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0xc] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x17] = 3.16202013338398e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x18] = 9.88131291682493e-324;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x19] = 9.48606040015193e-322;
    local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
    array[0x16] = local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.
                  m_storage.m_data.array[9];
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12400,
               (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,lVar1,0x140);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,192,3,0,192,3>,64,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12400,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_192,_3,_0,_192,_3>,_64,_1,_false>_>_>_>
                *)&local_c680);
    IStack_12cb0 = IStack_12cb0 + 3;
    lVar11 = lVar11 + 1;
  }
  std::__shared_ptr<chrono::fea::ChMaterialHexaANCF,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::fea::ChMaterialHexaANCF,_(__gnu_cxx::_Lock_policy)2> *)
             &local_c680,
             &(pCStack_12c68->m_material).
              super___shared_ptr<chrono::fea::ChMaterialHexaANCF,_(__gnu_cxx::_Lock_policy)2>);
  dVar4 = local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.
          m_data.array[0];
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.
              m_storage.m_data.array + 1));
  PStack_12b80.m_storage.m_cols = 0;
  PStack_12b80.m_storage.m_data = (double *)0x0;
  PStack_12b80.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::resize
            (&PStack_12b80,0x60,0x180);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)&MStack_11500,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,0,0);
  scalar = &(((non_const_type)((long)dVar4 + 0x18))->
            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>
                    *)auStack_12400,(double *)scalar,(StorageBaseType *)&MStack_11500);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)auStack_11740,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,0,0x40);
  scalar_00 = &(((non_const_type)((long)dVar4 + 0x18))->
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_cols;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>
                    *)auStack_12140,(double *)scalar_00,(StorageBaseType *)auStack_11740);
  uVar7 = auStack_12400._16_8_;
  MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [0] = (double)auStack_12400._24_8_;
  MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [1] = (double)vStack_123e0.m_value;
  MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [2] = (double)pMStack_123d8;
  MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [3] = (double)vStack_123d0.m_value;
  MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [4] = (double)vStack_123c8.m_value;
  MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [5] = dStack_123c0;
  pIStack_12c80 = (Index *)auStack_12140._16_8_;
  MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [0] = (double)auStack_12140._24_8_;
  MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [1] = (double)auStack_12140._32_8_;
  MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [2] = (double)pMStack_12118;
  MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [3] = (double)vStack_12110.m_value;
  MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [4] = (double)vStack_12108.m_value;
  MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [5] = (double)pMStack_12100;
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)&MStack_11d40,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,0,0x80);
  pMStack_12bf8 = (non_const_type)((long)dVar4 + 0x30);
  Eigen::operator*(aCStack_11f40,(double *)pMStack_12bf8,(StorageBaseType *)&MStack_11d40);
  vStack_128a0.m_value = uVar7;
  pMStack_12898 =
       (RhsNested)
       MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
       array[0];
  dStack_12890 = MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[1];
  pMStack_12888 =
       (XprTypeNested)
       MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
       array[2];
  dStack_12880 = MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[3];
  dStack_12878 = MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[4];
  dStack_12870 = MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[5];
  dStack_12850 = (double)pIStack_12c80;
  pdStack_12848 =
       (PointerType)
       MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
       array[0];
  dStack_12840 = MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[1];
  pMStack_12838 =
       (XprTypeNested)
       MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
       array[2];
  dStack_12830 = MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[3];
  dStack_12828 = MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[4];
  pMStack_12820 =
       (RhsNested)
       MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
       array[5];
  dStack_127f8 = aCStack_11f40[0].m_lhs.m_functor.m_other;
  pdStack_127f0 =
       aCStack_11f40[0].m_rhs.
       super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>,_0>.
       m_data;
  uStack_127e8 = aCStack_11f40[0].m_rhs.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>,_0>
                 ._8_8_;
  pMStack_127e0 =
       aCStack_11f40[0].m_rhs.
       super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_true>.m_xpr;
  lStack_127d8 = aCStack_11f40[0].m_rhs.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_true>
                 .m_startRow.m_value;
  lStack_127d0 = aCStack_11f40[0].m_rhs.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_true>
                 .m_startCol.m_value;
  IStack_127c8 = aCStack_11f40[0].m_rhs.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_true>
                 .m_outerStride;
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)auStack_129a0,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,0,0xc0);
  pIStack_12c00 =
       &(((non_const_type)((long)dVar4 + 0x30))->
        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows;
  Eigen::operator*(aCStack_11100,(double *)pIStack_12c00,(StorageBaseType *)auStack_129a0);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>
               *)auStack_12680,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>>
               *)auStack_128c0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>
               *)aCStack_11100);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)auStack_12b38,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,0,0x100);
  pdStack_12c08 =
       (double *)
       &(((non_const_type)((long)dVar4 + 0x30))->
        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_cols;
  Eigen::operator*(aCStack_11300,pdStack_12c08,(StorageBaseType *)auStack_12b38);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>
               *)auStack_10f00,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>>
               *)auStack_12680,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>
               *)aCStack_11300);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)auStack_12be0,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,0,0x140);
  pMStack_129b0 = (non_const_type)((long)dVar4 + 0x48);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>
                    *)&local_fe80,(double *)pMStack_129b0,(StorageBaseType *)auStack_12be0);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>>
  ::operator+((CwiseBinaryOp<_800f67d9_> *)&local_c680,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>>
               *)auStack_10f00,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>
               *)&local_fe80);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)&RStack_12c40,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12b80,0,0);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>>
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)&RStack_12c40,
             (CwiseBinaryOp<_800f67d9_> *)&local_c680);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)&MStack_11500,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,0,0);
  pIStack_129b8 =
       &(((non_const_type)((long)dVar4 + 0x48))->
        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>
                    *)auStack_12400,(double *)pIStack_129b8,(StorageBaseType *)&MStack_11500);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)auStack_11740,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,0,0x40);
  pIStack_129c0 =
       &(((non_const_type)((long)dVar4 + 0x48))->
        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_cols;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>
                    *)auStack_12140,(double *)pIStack_129c0,(StorageBaseType *)auStack_11740);
  uVar7 = auStack_12400._16_8_;
  MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [0] = (double)auStack_12400._24_8_;
  MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [1] = (double)vStack_123e0.m_value;
  MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [2] = (double)pMStack_123d8;
  MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [3] = (double)vStack_123d0.m_value;
  MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [4] = (double)vStack_123c8.m_value;
  MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [5] = dStack_123c0;
  pIStack_12c80 = (Index *)auStack_12140._16_8_;
  MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [0] = (double)auStack_12140._24_8_;
  MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [1] = (double)auStack_12140._32_8_;
  MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [2] = (double)pMStack_12118;
  MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [3] = (double)vStack_12110.m_value;
  MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [4] = (double)vStack_12108.m_value;
  MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [5] = (double)pMStack_12100;
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)&MStack_11d40,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,0,0x80);
  pMStack_129c8 = (non_const_type)((long)dVar4 + 0x60);
  Eigen::operator*(aCStack_11f40,(double *)pMStack_129c8,(StorageBaseType *)&MStack_11d40);
  vStack_128a0.m_value = uVar7;
  pMStack_12898 =
       (RhsNested)
       MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
       array[0];
  dStack_12890 = MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[1];
  pMStack_12888 =
       (XprTypeNested)
       MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
       array[2];
  dStack_12880 = MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[3];
  dStack_12878 = MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[4];
  dStack_12870 = MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[5];
  dStack_12850 = (double)pIStack_12c80;
  pdStack_12848 =
       (PointerType)
       MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
       array[0];
  dStack_12840 = MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[1];
  pMStack_12838 =
       (XprTypeNested)
       MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
       array[2];
  dStack_12830 = MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[3];
  dStack_12828 = MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[4];
  pMStack_12820 =
       (RhsNested)
       MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
       array[5];
  dStack_127f8 = aCStack_11f40[0].m_lhs.m_functor.m_other;
  pdStack_127f0 =
       aCStack_11f40[0].m_rhs.
       super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>,_0>.
       m_data;
  uStack_127e8 = aCStack_11f40[0].m_rhs.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>,_0>
                 ._8_8_;
  pMStack_127e0 =
       aCStack_11f40[0].m_rhs.
       super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_true>.m_xpr;
  lStack_127d8 = aCStack_11f40[0].m_rhs.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_true>
                 .m_startRow.m_value;
  lStack_127d0 = aCStack_11f40[0].m_rhs.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_true>
                 .m_startCol.m_value;
  IStack_127c8 = aCStack_11f40[0].m_rhs.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_true>
                 .m_outerStride;
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)auStack_129a0,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,0,0xc0);
  pIStack_129d0 =
       &(((non_const_type)((long)dVar4 + 0x60))->
        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows;
  Eigen::operator*(aCStack_11100,(double *)pIStack_129d0,(StorageBaseType *)auStack_129a0);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>
               *)auStack_12680,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>>
               *)auStack_128c0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>
               *)aCStack_11100);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)auStack_12b38,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,0,0x100);
  pIStack_129d8 =
       &(((non_const_type)((long)dVar4 + 0x60))->
        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_cols;
  Eigen::operator*(aCStack_11300,(double *)pIStack_129d8,(StorageBaseType *)auStack_12b38);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>
               *)auStack_10f00,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>>
               *)auStack_12680,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>
               *)aCStack_11300);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)auStack_12be0,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,0,0x140);
  pMStack_129e0 = (non_const_type)((long)dVar4 + 0x78);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>
                    *)&local_fe80,(double *)pMStack_129e0,(StorageBaseType *)auStack_12be0);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>>
  ::operator+((CwiseBinaryOp<_800f67d9_> *)&local_c680,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>>
               *)auStack_10f00,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>
               *)&local_fe80);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)&RStack_12c40,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12b80,0,0x40);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>>
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)&RStack_12c40,
             (CwiseBinaryOp<_800f67d9_> *)&local_c680);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)&MStack_11500,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,0,0);
  pIStack_129e8 =
       &(((non_const_type)((long)dVar4 + 0x78))->
        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>
                    *)auStack_12400,(double *)pIStack_129e8,(StorageBaseType *)&MStack_11500);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)auStack_11740,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,0,0x40);
  pIStack_129f0 =
       &(((non_const_type)((long)dVar4 + 0x78))->
        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_cols;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>
                    *)auStack_12140,(double *)pIStack_129f0,(StorageBaseType *)auStack_11740);
  uVar7 = auStack_12400._16_8_;
  MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [0] = (double)auStack_12400._24_8_;
  MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [1] = (double)vStack_123e0.m_value;
  MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [2] = (double)pMStack_123d8;
  MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [3] = (double)vStack_123d0.m_value;
  MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [4] = (double)vStack_123c8.m_value;
  MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [5] = dStack_123c0;
  pIStack_12c80 = (Index *)auStack_12140._16_8_;
  MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [0] = (double)auStack_12140._24_8_;
  MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [1] = (double)auStack_12140._32_8_;
  MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [2] = (double)pMStack_12118;
  MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [3] = (double)vStack_12110.m_value;
  MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [4] = (double)vStack_12108.m_value;
  MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [5] = (double)pMStack_12100;
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)&MStack_11d40,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,0,0x80);
  pMStack_129f8 = (non_const_type)((long)dVar4 + 0x90);
  Eigen::operator*(aCStack_11f40,(double *)pMStack_129f8,(StorageBaseType *)&MStack_11d40);
  vStack_128a0.m_value = uVar7;
  pMStack_12898 =
       (RhsNested)
       MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
       array[0];
  dStack_12890 = MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[1];
  pMStack_12888 =
       (XprTypeNested)
       MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
       array[2];
  dStack_12880 = MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[3];
  dStack_12878 = MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[4];
  dStack_12870 = MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[5];
  dStack_12850 = (double)pIStack_12c80;
  pdStack_12848 =
       (PointerType)
       MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
       array[0];
  dStack_12840 = MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[1];
  pMStack_12838 =
       (XprTypeNested)
       MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
       array[2];
  dStack_12830 = MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[3];
  dStack_12828 = MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[4];
  pMStack_12820 =
       (RhsNested)
       MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
       array[5];
  dStack_127f8 = aCStack_11f40[0].m_lhs.m_functor.m_other;
  pdStack_127f0 =
       aCStack_11f40[0].m_rhs.
       super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>,_0>.
       m_data;
  uStack_127e8 = aCStack_11f40[0].m_rhs.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>,_0>
                 ._8_8_;
  pMStack_127e0 =
       aCStack_11f40[0].m_rhs.
       super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_true>.m_xpr;
  lStack_127d8 = aCStack_11f40[0].m_rhs.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_true>
                 .m_startRow.m_value;
  lStack_127d0 = aCStack_11f40[0].m_rhs.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_true>
                 .m_startCol.m_value;
  IStack_127c8 = aCStack_11f40[0].m_rhs.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_true>
                 .m_outerStride;
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)auStack_129a0,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,0,0xc0);
  pIStack_12a00 =
       &(((non_const_type)((long)dVar4 + 0x90))->
        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows;
  Eigen::operator*(aCStack_11100,(double *)pIStack_12a00,(StorageBaseType *)auStack_129a0);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>
               *)auStack_12680,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>>
               *)auStack_128c0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>
               *)aCStack_11100);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)auStack_12b38,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,0,0x100);
  pIStack_12a08 =
       &(((non_const_type)((long)dVar4 + 0x90))->
        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_cols;
  Eigen::operator*(aCStack_11300,(double *)pIStack_12a08,(StorageBaseType *)auStack_12b38);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>
               *)auStack_10f00,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>>
               *)auStack_12680,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>
               *)aCStack_11300);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)auStack_12be0,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,0,0x140);
  pMStack_12a10 = (non_const_type)((long)dVar4 + 0xa8);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>
                    *)&local_fe80,(double *)pMStack_12a10,(StorageBaseType *)auStack_12be0);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>>
  ::operator+((CwiseBinaryOp<_800f67d9_> *)&local_c680,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>>
               *)auStack_10f00,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>
               *)&local_fe80);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)&RStack_12c40,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12b80,0,0x80);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>>
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)&RStack_12c40,
             (CwiseBinaryOp<_800f67d9_> *)&local_c680);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)&MStack_11500,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,0,0);
  pIStack_12a18 =
       &(((non_const_type)((long)dVar4 + 0xa8))->
        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>
                    *)auStack_12400,(double *)pIStack_12a18,(StorageBaseType *)&MStack_11500);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)auStack_11740,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,0,0x40);
  pIStack_12a20 =
       &(((non_const_type)((long)dVar4 + 0xa8))->
        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_cols;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>
                    *)auStack_12140,(double *)pIStack_12a20,(StorageBaseType *)auStack_11740);
  uVar7 = auStack_12400._16_8_;
  MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [0] = (double)auStack_12400._24_8_;
  MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [1] = (double)vStack_123e0.m_value;
  MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [2] = (double)pMStack_123d8;
  MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [3] = (double)vStack_123d0.m_value;
  MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [4] = (double)vStack_123c8.m_value;
  MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [5] = dStack_123c0;
  pIStack_12c80 = (Index *)auStack_12140._16_8_;
  MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [0] = (double)auStack_12140._24_8_;
  MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [1] = (double)auStack_12140._32_8_;
  MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [2] = (double)pMStack_12118;
  MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [3] = (double)vStack_12110.m_value;
  MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [4] = (double)vStack_12108.m_value;
  MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [5] = (double)pMStack_12100;
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)&MStack_11d40,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,0,0x80);
  pMStack_12a28 = (non_const_type)((long)dVar4 + 0xc0);
  Eigen::operator*(aCStack_11f40,(double *)pMStack_12a28,(StorageBaseType *)&MStack_11d40);
  vStack_128a0.m_value = uVar7;
  pMStack_12898 =
       (RhsNested)
       MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
       array[0];
  dStack_12890 = MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[1];
  pMStack_12888 =
       (XprTypeNested)
       MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
       array[2];
  dStack_12880 = MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[3];
  dStack_12878 = MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[4];
  dStack_12870 = MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[5];
  dStack_12850 = (double)pIStack_12c80;
  pdStack_12848 =
       (PointerType)
       MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
       array[0];
  dStack_12840 = MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[1];
  pMStack_12838 =
       (XprTypeNested)
       MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
       array[2];
  dStack_12830 = MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[3];
  dStack_12828 = MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[4];
  pMStack_12820 =
       (RhsNested)
       MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
       array[5];
  dStack_127f8 = aCStack_11f40[0].m_lhs.m_functor.m_other;
  pdStack_127f0 =
       aCStack_11f40[0].m_rhs.
       super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>,_0>.
       m_data;
  uStack_127e8 = aCStack_11f40[0].m_rhs.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>,_0>
                 ._8_8_;
  pMStack_127e0 =
       aCStack_11f40[0].m_rhs.
       super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_true>.m_xpr;
  lStack_127d8 = aCStack_11f40[0].m_rhs.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_true>
                 .m_startRow.m_value;
  lStack_127d0 = aCStack_11f40[0].m_rhs.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_true>
                 .m_startCol.m_value;
  IStack_127c8 = aCStack_11f40[0].m_rhs.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_true>
                 .m_outerStride;
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)auStack_129a0,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,0,0xc0);
  pIStack_12a30 =
       &(((non_const_type)((long)dVar4 + 0xc0))->
        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows;
  Eigen::operator*(aCStack_11100,(double *)pIStack_12a30,(StorageBaseType *)auStack_129a0);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>
               *)auStack_12680,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>>
               *)auStack_128c0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>
               *)aCStack_11100);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)auStack_12b38,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,0,0x100);
  pIStack_12a38 =
       &(((non_const_type)((long)dVar4 + 0xc0))->
        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_cols;
  Eigen::operator*(aCStack_11300,(double *)pIStack_12a38,(StorageBaseType *)auStack_12b38);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>
               *)auStack_10f00,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>>
               *)auStack_12680,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>
               *)aCStack_11300);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)auStack_12be0,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,0,0x140);
  pMStack_12a40 = (non_const_type)((long)dVar4 + 0xd8);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>
                    *)&local_fe80,(double *)pMStack_12a40,(StorageBaseType *)auStack_12be0);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>>
  ::operator+((CwiseBinaryOp<_800f67d9_> *)&local_c680,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>>
               *)auStack_10f00,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>
               *)&local_fe80);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)&RStack_12c40,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12b80,0,0xc0);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>>
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)&RStack_12c40,
             (CwiseBinaryOp<_800f67d9_> *)&local_c680);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)&MStack_11500,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,0,0);
  pIStack_12a50 =
       &(((non_const_type)((long)dVar4 + 0xd8))->
        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>
                    *)auStack_12400,(double *)pIStack_12a50,(StorageBaseType *)&MStack_11500);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)auStack_11740,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,0,0x40);
  pIStack_12a58 =
       &(((non_const_type)((long)dVar4 + 0xd8))->
        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_cols;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>
                    *)auStack_12140,(double *)pIStack_12a58,(StorageBaseType *)auStack_11740);
  uVar7 = auStack_12400._16_8_;
  MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [0] = (double)auStack_12400._24_8_;
  MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [1] = (double)vStack_123e0.m_value;
  MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [2] = (double)pMStack_123d8;
  MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [3] = (double)vStack_123d0.m_value;
  MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [4] = (double)vStack_123c8.m_value;
  MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [5] = dStack_123c0;
  pIStack_12c80 = (Index *)auStack_12140._16_8_;
  MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [0] = (double)auStack_12140._24_8_;
  MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [1] = (double)auStack_12140._32_8_;
  MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [2] = (double)pMStack_12118;
  MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [3] = (double)vStack_12110.m_value;
  MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [4] = (double)vStack_12108.m_value;
  MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [5] = (double)pMStack_12100;
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)&MStack_11d40,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,0,0x80);
  pMStack_12a60 = (non_const_type)((long)dVar4 + 0xf0);
  Eigen::operator*(aCStack_11f40,(double *)pMStack_12a60,(StorageBaseType *)&MStack_11d40);
  vStack_128a0.m_value = uVar7;
  pMStack_12898 =
       (RhsNested)
       MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
       array[0];
  dStack_12890 = MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[1];
  pMStack_12888 =
       (XprTypeNested)
       MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
       array[2];
  dStack_12880 = MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[3];
  dStack_12878 = MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[4];
  dStack_12870 = MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[5];
  dStack_12850 = (double)pIStack_12c80;
  pdStack_12848 =
       (PointerType)
       MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
       array[0];
  dStack_12840 = MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[1];
  pMStack_12838 =
       (XprTypeNested)
       MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
       array[2];
  dStack_12830 = MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[3];
  dStack_12828 = MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[4];
  pMStack_12820 =
       (RhsNested)
       MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
       array[5];
  dStack_127f8 = aCStack_11f40[0].m_lhs.m_functor.m_other;
  pdStack_127f0 =
       aCStack_11f40[0].m_rhs.
       super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>,_0>.
       m_data;
  uStack_127e8 = aCStack_11f40[0].m_rhs.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>,_0>
                 ._8_8_;
  pMStack_127e0 =
       aCStack_11f40[0].m_rhs.
       super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_true>.m_xpr;
  lStack_127d8 = aCStack_11f40[0].m_rhs.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_true>
                 .m_startRow.m_value;
  lStack_127d0 = aCStack_11f40[0].m_rhs.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_true>
                 .m_startCol.m_value;
  IStack_127c8 = aCStack_11f40[0].m_rhs.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_true>
                 .m_outerStride;
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)auStack_129a0,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,0,0xc0);
  pIStack_12a68 =
       &(((non_const_type)((long)dVar4 + 0xf0))->
        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows;
  Eigen::operator*(aCStack_11100,(double *)pIStack_12a68,(StorageBaseType *)auStack_129a0);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>
               *)auStack_12680,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>>
               *)auStack_128c0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>
               *)aCStack_11100);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)auStack_12b38,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,0,0x100);
  pIStack_12a70 =
       &(((non_const_type)((long)dVar4 + 0xf0))->
        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_cols;
  Eigen::operator*(aCStack_11300,(double *)pIStack_12a70,(StorageBaseType *)auStack_12b38);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>
               *)auStack_10f00,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>>
               *)auStack_12680,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>
               *)aCStack_11300);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)auStack_12be0,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,0,0x140);
  pMStack_12a78 = (non_const_type)((long)dVar4 + 0x108);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>
                    *)&local_fe80,(double *)pMStack_12a78,(StorageBaseType *)auStack_12be0);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>>
  ::operator+((CwiseBinaryOp<_800f67d9_> *)&local_c680,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>>
               *)auStack_10f00,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>
               *)&local_fe80);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)&RStack_12c40,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12b80,0,0x100);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>>
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)&RStack_12c40,
             (CwiseBinaryOp<_800f67d9_> *)&local_c680);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)&MStack_11500,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,0,0);
  pIStack_12a80 =
       &(((non_const_type)((long)dVar4 + 0x108))->
        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>
                    *)auStack_12400,(double *)pIStack_12a80,(StorageBaseType *)&MStack_11500);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)auStack_11740,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,0,0x40);
  pIStack_12a88 =
       &(((non_const_type)((long)dVar4 + 0x108))->
        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_cols;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>
                    *)auStack_12140,(double *)pIStack_12a88,(StorageBaseType *)auStack_11740);
  uVar7 = auStack_12400._16_8_;
  MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [0] = (double)auStack_12400._24_8_;
  MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [1] = (double)vStack_123e0.m_value;
  MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [2] = (double)pMStack_123d8;
  MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [3] = (double)vStack_123d0.m_value;
  MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [4] = (double)vStack_123c8.m_value;
  MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [5] = dStack_123c0;
  pIStack_12c80 = (Index *)auStack_12140._16_8_;
  MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [0] = (double)auStack_12140._24_8_;
  MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [1] = (double)auStack_12140._32_8_;
  MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [2] = (double)pMStack_12118;
  MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [3] = (double)vStack_12110.m_value;
  MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [4] = (double)vStack_12108.m_value;
  MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [5] = (double)pMStack_12100;
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)&MStack_11d40,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,0,0x80);
  pMStack_12a90 = (non_const_type)((long)dVar4 + 0x120);
  Eigen::operator*(aCStack_11f40,(double *)pMStack_12a90,(StorageBaseType *)&MStack_11d40);
  vStack_128a0.m_value = uVar7;
  pMStack_12898 =
       (RhsNested)
       MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
       array[0];
  dStack_12890 = MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[1];
  pMStack_12888 =
       (XprTypeNested)
       MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
       array[2];
  dStack_12880 = MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[3];
  dStack_12878 = MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[4];
  dStack_12870 = MStack_11940.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[5];
  dStack_12850 = (double)pIStack_12c80;
  pdStack_12848 =
       (PointerType)
       MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
       array[0];
  dStack_12840 = MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[1];
  pMStack_12838 =
       (XprTypeNested)
       MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
       array[2];
  dStack_12830 = MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[3];
  dStack_12828 = MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.
                 m_storage.m_data.array[4];
  pMStack_12820 =
       (RhsNested)
       MStack_11b40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
       array[5];
  dStack_127f8 = aCStack_11f40[0].m_lhs.m_functor.m_other;
  pdStack_127f0 =
       aCStack_11f40[0].m_rhs.
       super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>,_0>.
       m_data;
  uStack_127e8 = aCStack_11f40[0].m_rhs.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>,_0>
                 ._8_8_;
  pMStack_127e0 =
       aCStack_11f40[0].m_rhs.
       super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_true>.m_xpr;
  lStack_127d8 = aCStack_11f40[0].m_rhs.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_true>
                 .m_startRow.m_value;
  lStack_127d0 = aCStack_11f40[0].m_rhs.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_true>
                 .m_startCol.m_value;
  IStack_127c8 = aCStack_11f40[0].m_rhs.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false,_true>
                 .m_outerStride;
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)auStack_129a0,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,0,0xc0);
  pIStack_12a98 =
       &(((non_const_type)((long)dVar4 + 0x120))->
        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows;
  Eigen::operator*(aCStack_11100,(double *)pIStack_12a98,(StorageBaseType *)auStack_129a0);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>
               *)auStack_12680,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>>
               *)auStack_128c0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>
               *)aCStack_11100);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)auStack_12b38,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,0,0x100);
  pIStack_12aa0 =
       &(((non_const_type)((long)dVar4 + 0x120))->
        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_cols;
  Eigen::operator*(aCStack_11300,(double *)pIStack_12aa0,(StorageBaseType *)auStack_12b38);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>
               *)auStack_10f00,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>>
               *)auStack_12680,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>
               *)aCStack_11300);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)auStack_12be0,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12ca0,0,0x140);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>
                    *)&local_fe80,(double *)((long)dVar4 + 0x138),(StorageBaseType *)auStack_12be0);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,96,64,false>const>const>>
  ::operator+((CwiseBinaryOp<_800f67d9_> *)&local_c680,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>>
               *)auStack_10f00,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_64,_1,_96,_64>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false>_>_>
               *)&local_fe80);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_96,_64,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)&RStack_12c40,
             (Matrix<double,__1,__1,_1,__1,__1> *)&PStack_12b80,0,0x140);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,64,1,96,64>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,96,64,false>const>const>>
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_96,_64,_false> *)&RStack_12c40,
             (CwiseBinaryOp<_800f67d9_> *)&local_c680);
  pIStack_12c80 = scalar;
  auStack_10f00._0_8_ = &PStack_12b80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array._0_16_ = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&PStack_12c60,
                            (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                             *)auStack_10f00);
  Eigen::internal::
  call_assignment<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>,0>>
            ((Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)pDVar6,
             (Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_0>
              *)&local_c680);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x15] = (double)(local_d480 + 0x200);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x23] = (double)(local_d480 + 0x800);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[8] = (double)local_d880;
  puVar2 = local_e680 + 0x200;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[5] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[6] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[7] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xb] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xc] = 1.48219693752374e-323;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xd] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x12] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x13] = 4.94065645841247e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x14] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x18] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x19] = 1.97626258336499e-323;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1a] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x20] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x21] = 9.88131291682493e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x22] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x26] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x27] = 2.47032822920623e-323;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x28] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[2] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[4] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[10] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xf] = (double)puVar2;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x11] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x17] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1d] = (double)local_de80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1f] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x25] = (double)local_ea80;
  Eigen::PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)auStack_12680,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>_>
              *)&local_c680);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[5] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[6] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[7] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xb] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xc] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xd] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x12] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x13] = 4.94065645841247e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x14] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x18] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x19] = 4.94065645841247e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1a] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x20] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x21] = 9.88131291682493e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x22] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x26] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x27] = 9.88131291682493e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x28] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[2] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[4] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[8] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[10] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xf] = (double)puVar2;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x11] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x15] = (double)puVar2;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x17] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1d] = (double)local_de80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1f] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x23] = (double)local_de80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x25] = (double)local_ea80;
  Eigen::PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)auStack_128c0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>_>
              *)&local_c680);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0] = (double)&DAT_3ff0000000000000;
  auStack_10f00._0_8_ = (PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)auStack_128c0;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>::operator-=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_> *)
             auStack_10f00,(Scalar *)&local_c680);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0] = 0.5;
  Eigen::DenseBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_> *)auStack_128c0,
             (Scalar *)&local_c680);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)&local_c680,pdStack_12c70,(StorageBaseType *)auStack_12680);
  Eigen::MatrixBase<Eigen::Matrix<double,64,1,0,64,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,64,1,0,64,1>> *)auStack_128c0,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
              *)&local_c680);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0] = (double)peStack_12c78;
  pMStack_12a48 = (non_const_type)((long)dVar4 + 0x138);
  auStack_10f00._0_8_ = (MatrixBase<Eigen::Matrix<double,64,1,0,64,1>> *)auStack_128c0;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,64,1,0,64,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,64,1,0,64,1>>> *)auStack_10f00,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_c680);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[8] = (double)(local_d880 + 0x200);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x23] = (double)(local_d480 + 0xa00);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[2] = (double)local_e880;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x15] = (double)(local_d480 + 0x400);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[5] = 3.16202013338398e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[6] = 0.0;
  puVar2 = local_e680 + 0x400;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[7] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xb] = 3.16202013338398e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xc] = 1.48219693752374e-323;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xd] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x12] = 3.16202013338398e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x13] = 4.94065645841247e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x14] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x18] = 3.16202013338398e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x19] = 1.97626258336499e-323;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1a] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x20] = 3.16202013338398e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x21] = 9.88131291682493e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x22] = 9.48606040015193e-322;
  auStack_10f00._0_8_ = auStack_12680;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x26] = 3.16202013338398e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x27] = 2.47032822920623e-323;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x28] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[4] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[10] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xf] = (double)puVar2;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x11] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x17] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1d] = (double)local_dc80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1f] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x25] = (double)local_ea80;
  Eigen::NoAlias<Eigen::Matrix<double,64,1,0,64,1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,64,1,0,64,1>,Eigen::MatrixBase> *)auStack_10f00,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>_>
              *)&local_c680);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[2] = (double)local_e880;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[5] = 3.16202013338398e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[6] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[7] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xb] = 3.16202013338398e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xc] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xd] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x12] = 3.16202013338398e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x13] = 4.94065645841247e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x14] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x18] = 3.16202013338398e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x19] = 4.94065645841247e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1a] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x20] = 3.16202013338398e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x21] = 9.88131291682493e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x22] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x26] = 3.16202013338398e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x27] = 9.88131291682493e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x28] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[4] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[8] = local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage
             .m_data.array[2];
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[10] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xf] = (double)puVar2;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x11] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x15] = (double)puVar2;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x17] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1d] = (double)local_dc80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1f] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x23] = (double)local_dc80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x25] = (double)local_ea80;
  Eigen::PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)auStack_12400,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>_>
              *)&local_c680);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0] = (double)&DAT_3ff0000000000000;
  auStack_10f00._0_8_ = (PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)auStack_12400;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>::operator-=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_> *)
             auStack_10f00,(Scalar *)&local_c680);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0] = 0.5;
  Eigen::DenseBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_> *)auStack_12400,
             (Scalar *)&local_c680);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)&local_c680,pdStack_12c70,(StorageBaseType *)auStack_12680);
  Eigen::MatrixBase<Eigen::Matrix<double,64,1,0,64,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,64,1,0,64,1>> *)auStack_12400,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
              *)&local_c680);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0] = (double)peStack_12c78;
  auStack_10f00._0_8_ = (MatrixBase<Eigen::Matrix<double,64,1,0,64,1>> *)auStack_12400;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,64,1,0,64,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,64,1,0,64,1>>> *)auStack_10f00,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_c680);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[8] = (double)local_d480;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x15] = (double)(local_d480 + 0x600);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x23] = (double)(local_d480 + 0xc00);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[5] = 6.32404026676796e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[6] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[7] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xb] = 6.32404026676796e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xc] = 1.48219693752374e-323;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xd] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x12] = 6.32404026676796e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x13] = 4.94065645841247e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x14] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x18] = 6.32404026676796e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x19] = 1.97626258336499e-323;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1a] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x20] = 6.32404026676796e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x21] = 9.88131291682493e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x22] = 9.48606040015193e-322;
  auStack_10f00._0_8_ = auStack_12680;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x26] = 6.32404026676796e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x27] = 2.47032822920623e-323;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x28] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[2] = (double)local_e680;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[4] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[10] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xf] = (double)local_e080;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x11] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x17] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1d] = (double)local_da80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1f] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x25] = (double)local_ea80;
  Eigen::NoAlias<Eigen::Matrix<double,64,1,0,64,1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,64,1,0,64,1>,Eigen::MatrixBase> *)auStack_10f00,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>_>
              *)&local_c680);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[2] = (double)local_e680;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[5] = 6.32404026676796e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[6] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[7] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xb] = 6.32404026676796e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xc] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xd] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x12] = 6.32404026676796e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x13] = 4.94065645841247e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x14] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x18] = 6.32404026676796e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x19] = 4.94065645841247e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1a] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x20] = 6.32404026676796e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x21] = 9.88131291682493e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x22] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x26] = 6.32404026676796e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x27] = 9.88131291682493e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x28] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[4] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[8] = local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage
             .m_data.array[2];
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[10] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xf] = (double)local_e080;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x11] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x15] = (double)local_e080;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x17] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1d] = (double)local_da80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1f] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x23] = (double)local_da80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x25] = (double)local_ea80;
  Eigen::PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)auStack_12140,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>_>
              *)&local_c680);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0] = (double)&DAT_3ff0000000000000;
  auStack_10f00._0_8_ = (PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)auStack_12140;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>::operator-=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_> *)
             auStack_10f00,(Scalar *)&local_c680);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0] = 0.5;
  Eigen::DenseBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_> *)auStack_12140,
             (Scalar *)&local_c680);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)&local_c680,pdStack_12c70,(StorageBaseType *)auStack_12680);
  Eigen::MatrixBase<Eigen::Matrix<double,64,1,0,64,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,64,1,0,64,1>> *)auStack_12140,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
              *)&local_c680);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0] = (double)peStack_12c78;
  auStack_10f00._0_8_ = (MatrixBase<Eigen::Matrix<double,64,1,0,64,1>> *)auStack_12140;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,64,1,0,64,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,64,1,0,64,1>>> *)auStack_10f00,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_c680);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xb] = (double)(local_d880 + 0x200);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[8] = 6.32404026676796e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[9] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[10] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xe] = 3.16202013338398e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x12] = (double)local_e080;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xf] = 1.48219693752374e-323;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x10] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x15] = 6.32404026676796e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x18] = (double)(local_d480 + 0x400);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x16] = 4.94065645841247e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x17] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1b] = 3.16202013338398e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x20] = (double)local_da80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1c] = 1.97626258336499e-323;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1d] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x23] = 6.32404026676796e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x26] = (double)(local_d480 + 0xa00);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x24] = 9.88131291682493e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x25] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x29] = 3.16202013338398e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x2e] = (double)local_e880;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x2a] = 2.47032822920623e-323;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x2b] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x31] = 3.16202013338398e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x32] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x34] = (double)local_d480;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x33] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x37] = 6.32404026676796e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x38] = 1.48219693752374e-323;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x42] = (double)(local_d480 + 0x600);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x39] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x3f] = 3.16202013338398e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x40] = 4.94065645841247e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x41] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x50] = (double)(local_d480 + 0xc00);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x45] = 6.32404026676796e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x46] = 1.97626258336499e-323;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x47] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x4d] = 3.16202013338398e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x4e] = 9.88131291682493e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x4f] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x53] = 6.32404026676796e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x54] = 2.47032822920623e-323;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x55] = 9.48606040015193e-322;
  auStack_10f00._0_8_ = (StorageBaseType *)auStack_12680;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[5] = (double)local_e680;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[7] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xd] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x14] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1a] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x22] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x28] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x30] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x36] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x3c] = (double)(local_e680 + 0x400);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x3e] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x44] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x4a] = (double)local_dc80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x4c] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x52] = (double)local_ea80;
  Eigen::NoAlias<Eigen::Matrix<double,64,1,0,64,1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,64,1,0,64,1>,Eigen::MatrixBase> *)auStack_10f00,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>_>
              *)&local_c680);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[2] = (double)local_e880;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[8] = (double)local_e680;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[5] = 3.16202013338398e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[6] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[7] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xb] = 6.32404026676796e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xc] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xd] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x12] = 3.16202013338398e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x13] = 4.94065645841247e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x14] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x18] = 6.32404026676796e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x19] = 4.94065645841247e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1a] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x20] = 3.16202013338398e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x21] = 9.88131291682493e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x22] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x26] = 6.32404026676796e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x27] = 9.88131291682493e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x28] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[4] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[10] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xf] = (double)(local_e680 + 0x400);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x11] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x15] = (double)local_e080;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x17] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1d] = (double)local_dc80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1f] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x23] = (double)local_da80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x25] = (double)local_ea80;
  Eigen::PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)aCStack_11f40,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>_>
              *)&local_c680);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)&local_c680,pdStack_12c70,(StorageBaseType *)auStack_12680);
  Eigen::MatrixBase<Eigen::Matrix<double,64,1,0,64,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,64,1,0,64,1>> *)aCStack_11f40,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
              *)&local_c680);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0] = (double)peStack_12c78;
  auStack_10f00._0_8_ = (MatrixBase<Eigen::Matrix<double,64,1,0,64,1>> *)aCStack_11f40;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,64,1,0,64,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,64,1,0,64,1>>> *)auStack_10f00,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_c680);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[5] = (double)local_e680;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xb] = (double)local_d880;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[8] = 6.32404026676796e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[9] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[10] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xe] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xf] = 1.48219693752374e-323;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x10] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x15] = 6.32404026676796e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x18] = (double)(local_d480 + 0x200);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x16] = 4.94065645841247e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x17] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1b] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1c] = 1.97626258336499e-323;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1d] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x23] = 6.32404026676796e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x26] = (double)(local_d480 + 0x800);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x24] = 9.88131291682493e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x25] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x29] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x34] = (double)local_d480;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x2a] = 2.47032822920623e-323;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x2b] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x31] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x32] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x33] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x37] = 6.32404026676796e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x38] = 1.48219693752374e-323;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x42] = (double)(local_d480 + 0x600);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x39] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x3f] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x40] = 4.94065645841247e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x41] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x50] = (double)(local_d480 + 0xc00);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x45] = 6.32404026676796e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x46] = 1.97626258336499e-323;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x47] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x4d] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x4e] = 9.88131291682493e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x4f] = 9.48606040015193e-322;
  auStack_10f00._0_8_ = auStack_12680;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x53] = 6.32404026676796e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x54] = 2.47032822920623e-323;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x55] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[7] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xd] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x12] = (double)local_e080;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x14] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1a] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x20] = (double)local_da80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x22] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x28] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x2e] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x30] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x36] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x3c] = (double)(local_e680 + 0x200);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x3e] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x44] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x4a] = (double)local_de80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x4c] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x52] = (double)local_ea80;
  Eigen::NoAlias<Eigen::Matrix<double,64,1,0,64,1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,64,1,0,64,1>,Eigen::MatrixBase> *)auStack_10f00,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>_>
              *)&local_c680);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[8] = (double)local_e680;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[5] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[6] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[7] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xb] = 6.32404026676796e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xc] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xd] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x12] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x15] = (double)local_e080;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x13] = 4.94065645841247e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x14] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x18] = 6.32404026676796e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x19] = 4.94065645841247e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1a] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x20] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x23] = (double)local_da80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x21] = 9.88131291682493e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x22] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x26] = 6.32404026676796e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x27] = 9.88131291682493e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x28] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[2] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[4] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[10] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xf] = (double)(local_e680 + 0x200);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x11] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x17] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1d] = (double)local_de80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1f] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x25] = (double)local_ea80;
  Eigen::PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)aCStack_11100,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>_>
              *)&local_c680);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)&local_c680,pdStack_12c70,(StorageBaseType *)auStack_12680);
  Eigen::MatrixBase<Eigen::Matrix<double,64,1,0,64,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,64,1,0,64,1>> *)aCStack_11100,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
              *)&local_c680);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0] = (double)peStack_12c78;
  auStack_10f00._0_8_ = aCStack_11100;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,64,1,0,64,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,64,1,0,64,1>>> *)auStack_10f00,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_c680);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[5] = (double)local_e880;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xb] = (double)local_d880;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[8] = 3.16202013338398e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[9] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[10] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xe] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x12] = (double)(local_e680 + 0x400);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xf] = 1.48219693752374e-323;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x10] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x15] = 3.16202013338398e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x18] = (double)(local_d480 + 0x200);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x16] = 4.94065645841247e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x17] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1b] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1c] = 1.97626258336499e-323;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1d] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x23] = 3.16202013338398e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x26] = (double)(local_d480 + 0x800);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x24] = 9.88131291682493e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x25] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x29] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x34] = (double)(local_d880 + 0x200);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x2a] = 2.47032822920623e-323;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x2b] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x31] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x32] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x33] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x37] = 3.16202013338398e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x38] = 1.48219693752374e-323;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x42] = (double)(local_d480 + 0x400);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x39] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x3f] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x40] = 4.94065645841247e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x41] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x50] = (double)(local_d480 + 0xa00);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x45] = 3.16202013338398e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x46] = 1.97626258336499e-323;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x47] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x4d] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x4e] = 9.88131291682493e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x4f] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x53] = 3.16202013338398e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x54] = 2.47032822920623e-323;
  auStack_10f00._0_8_ = auStack_12680;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x55] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[7] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xd] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x14] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1a] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x20] = (double)local_dc80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x22] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x28] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x2e] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x30] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x36] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x3c] = (double)(local_e680 + 0x200);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x3e] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x44] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x4a] = (double)local_de80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x4c] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x52] = (double)local_ea80;
  Eigen::NoAlias<Eigen::Matrix<double,64,1,0,64,1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,64,1,0,64,1>,Eigen::MatrixBase> *)auStack_10f00,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>_>
              *)&local_c680);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[8] = (double)local_e880;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[5] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[6] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[7] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xb] = 3.16202013338398e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xc] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xd] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x12] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x15] = (double)(local_e680 + 0x400);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x13] = 4.94065645841247e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x14] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x18] = 3.16202013338398e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x19] = 4.94065645841247e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1a] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x20] = 0.0;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x23] = (double)local_dc80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x21] = 9.88131291682493e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x22] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x26] = 3.16202013338398e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x27] = 9.88131291682493e-324;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x28] = 9.48606040015193e-322;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[2] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[4] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[10] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0xf] = (double)(local_e680 + 0x200);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x11] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x17] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1d] = (double)local_de80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x1f] = (double)local_ea80;
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0x25] = (double)local_ea80;
  Eigen::PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const,Eigen::Block<Eigen::Matrix<double,192,6,0,192,6>,64,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)aCStack_11300,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_192,_6,_0,_192,_6>,_64,_1,_false>_>_>_>
              *)&local_c680);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)&local_c680,pdStack_12c70,(StorageBaseType *)auStack_12680);
  scalar_01 = pMStack_12a48;
  Eigen::MatrixBase<Eigen::Matrix<double,64,1,0,64,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,64,1,0,64,1>> *)aCStack_11300,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
              *)&local_c680);
  local_c680.super_PlainObjectBase<Eigen::Matrix<double,_32,_192,_1,_32,_192>_>.m_storage.m_data.
  array[0] = (double)peStack_12c78;
  auStack_10f00._0_8_ = aCStack_11300;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,64,1,0,64,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,64,1,0,64,1>>> *)auStack_10f00,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_c680);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)auStack_11740,(double *)pIStack_12c80,(StorageBaseType *)auStack_128c0);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)&MStack_11d40,(double *)scalar_00,(StorageBaseType *)auStack_12400);
  MStack_11500.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [3] = (double)auStack_11740._16_8_;
  MStack_11500.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [4] = (double)auStack_11740._24_8_;
  MStack_11500.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [8] = MStack_11d40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data
        .array[2];
  MStack_11500.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [9] = MStack_11d40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data
        .array[3];
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)auStack_129a0,(double *)pMStack_12bf8,(StorageBaseType *)auStack_12140);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&MStack_11b40,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)&MStack_11500,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)auStack_129a0);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)auStack_12b38,(double *)pIStack_12c00,(StorageBaseType *)aCStack_11f40);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&MStack_11940,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)&MStack_11b40,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)auStack_12b38);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)auStack_12be0,pdStack_12c08,(StorageBaseType *)aCStack_11100);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)auStack_10f00,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)&MStack_11940,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)auStack_12be0);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)&RStack_12c40,(double *)pMStack_129b0,(StorageBaseType *)aCStack_11300);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&local_c680,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)auStack_10f00,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&RStack_12c40);
  Eigen::PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)&local_fe80,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>_>
              *)&local_c680);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)&MStack_11d40,(double *)pIStack_129b8,(StorageBaseType *)auStack_128c0);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)auStack_129a0,(double *)pIStack_129c0,(StorageBaseType *)auStack_12400);
  auStack_11740._24_8_ =
       MStack_11d40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
       array[2];
  auStack_11740._32_8_ =
       MStack_11d40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.
       array[3];
  auStack_11740._64_8_ = sStack_12990.m_other;
  auStack_11740._72_8_ = sStack_12988.m_other;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)auStack_12b38,(double *)pMStack_129c8,(StorageBaseType *)auStack_12140);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&MStack_11500,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)auStack_11740,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)auStack_12b38);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)auStack_12be0,(double *)pIStack_129d0,(StorageBaseType *)aCStack_11f40);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&MStack_11b40,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)&MStack_11500,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)auStack_12be0);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)&RStack_12c40,(double *)pIStack_129d8,(StorageBaseType *)aCStack_11100);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)auStack_10f00,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)&MStack_11b40,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&RStack_12c40);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)&BStack_12b68,(double *)pMStack_129e0,(StorageBaseType *)aCStack_11300);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&local_c680,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)auStack_10f00,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&BStack_12b68);
  Eigen::PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)&MStack_11940,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>_>
              *)&local_c680);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)auStack_129a0,(double *)pIStack_129e8,(StorageBaseType *)auStack_128c0);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)auStack_12b38,(double *)pIStack_129f0,(StorageBaseType *)auStack_12400);
  MStack_11d40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [3] = sStack_12990.m_other;
  MStack_11d40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [4] = sStack_12988.m_other;
  MStack_11d40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [8] = sStack_12b28.m_other;
  MStack_11d40.super_PlainObjectBase<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
  [9] = sStack_12b20.m_other;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)auStack_12be0,(double *)pMStack_129f8,(StorageBaseType *)auStack_12140);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)auStack_11740,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)&MStack_11d40,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)auStack_12be0);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)&RStack_12c40,(double *)pIStack_12a00,(StorageBaseType *)aCStack_11f40);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&MStack_11500,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)auStack_11740,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&RStack_12c40);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)&BStack_12b68,(double *)pIStack_12a08,(StorageBaseType *)aCStack_11100);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)auStack_10f00,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)&MStack_11500,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&BStack_12b68);
  Eigen::operator*(&CStack_126a8,(double *)pMStack_12a10,(StorageBaseType *)aCStack_11300);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&local_c680,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)auStack_10f00,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&CStack_126a8);
  Eigen::PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)&MStack_11b40,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>_>
              *)&local_c680);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)auStack_12b38,(double *)pIStack_12a18,(StorageBaseType *)auStack_128c0);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)auStack_12be0,(double *)pIStack_12a20,(StorageBaseType *)auStack_12400);
  sStack_12988.m_other = sStack_12b28.m_other;
  sStack_12980.m_other = sStack_12b20.m_other;
  vStack_12960.m_value = (long)sStack_12bd0.m_other;
  sStack_12958.m_other = (double)vStack_12bc8.m_value;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)&RStack_12c40,(double *)pMStack_12a28,(StorageBaseType *)auStack_12140);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&MStack_11d40,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)auStack_129a0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&RStack_12c40);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)&BStack_12b68,(double *)pIStack_12a30,(StorageBaseType *)aCStack_11f40);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)auStack_11740,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)&MStack_11d40,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&BStack_12b68);
  Eigen::operator*(&CStack_126a8,(double *)pIStack_12a38,(StorageBaseType *)aCStack_11100);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)auStack_10f00,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)auStack_11740,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&CStack_126a8);
  Eigen::operator*(&CStack_12450,(double *)pMStack_12a40,(StorageBaseType *)aCStack_11300);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&local_c680,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)auStack_10f00,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&CStack_12450);
  Eigen::PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)&MStack_11500,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>_>
              *)&local_c680);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)auStack_12be0,(double *)pIStack_12a50,(StorageBaseType *)auStack_128c0);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)&RStack_12c40,(double *)pIStack_12a58,(StorageBaseType *)auStack_12400);
  sStack_12b20.m_other = sStack_12bd0.m_other;
  sStack_12b18.m_other = (double)vStack_12bc8.m_value;
  vStack_12af8.m_value =
       (long)RStack_12c40.m_matrix.
             super_BlockImpl<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_Eigen::Dense>
             .super_BlockImpl_dense<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_true>.
             m_xpr;
  sStack_12af0.m_other =
       (double)RStack_12c40.m_matrix.
               super_BlockImpl<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_Eigen::Dense>
               .
               super_BlockImpl_dense<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_true>
               .m_startRow.m_value;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)&BStack_12b68,(double *)pMStack_12a60,(StorageBaseType *)auStack_12140);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)auStack_129a0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)auStack_12b38,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&BStack_12b68);
  Eigen::operator*(&CStack_126a8,(double *)pIStack_12a68,(StorageBaseType *)aCStack_11f40);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&MStack_11d40,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)auStack_129a0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&CStack_126a8);
  Eigen::operator*(&CStack_12450,(double *)pIStack_12a70,(StorageBaseType *)aCStack_11100);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)auStack_10f00,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)&MStack_11d40,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&CStack_12450);
  Eigen::operator*(&CStack_12428,(double *)pMStack_12a78,(StorageBaseType *)aCStack_11300);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&local_c680,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)auStack_10f00,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&CStack_12428);
  Eigen::PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)auStack_11740,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>_>
              *)&local_c680);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)&RStack_12c40,(double *)pIStack_12a80,(StorageBaseType *)auStack_128c0);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)&BStack_12b68,(double *)pIStack_12a88,(StorageBaseType *)auStack_12400);
  vStack_12bc8.m_value =
       (long)RStack_12c40.m_matrix.
             super_BlockImpl<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_Eigen::Dense>
             .super_BlockImpl_dense<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_true>.
             m_xpr;
  vStack_12bc0.m_value =
       RStack_12c40.m_matrix.
       super_BlockImpl<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_true>.
       m_startRow.m_value;
  pMStack_12ba0 =
       BStack_12b68.
       super_BlockImpl<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_true>.m_xpr;
  pMStack_12b98 =
       (RhsNested)
       BStack_12b68.
       super_BlockImpl<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_true>.
       m_startRow.m_value;
  Eigen::operator*(&CStack_126a8,(double *)pMStack_12a90,(StorageBaseType *)auStack_12140);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)auStack_12b38,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)auStack_12be0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&CStack_126a8);
  Eigen::operator*(&CStack_12450,(double *)pIStack_12a98,(StorageBaseType *)aCStack_11f40);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)auStack_129a0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)auStack_12b38,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&CStack_12450);
  Eigen::operator*(&CStack_12428,(double *)pIStack_12aa0,(StorageBaseType *)aCStack_11100);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)auStack_10f00,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)auStack_129a0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&CStack_12428);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>
                    *)(auStack_11740 + 0x218),(double *)scalar_01,(StorageBaseType *)aCStack_11300);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)&local_c680,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
               *)auStack_10f00,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>
               *)(auStack_11740 + 0x218));
  Eigen::PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,1,0,64,1>const>const,Eigen::Matrix<double,64,1,0,64,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,64,1,0,64,1>> *)&MStack_11d40,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Matrix<double,_64,_1,_0,_64,_1>_>_>_>
              *)&local_c680);
  for (lVar11 = 0; lVar11 != 0x20; lVar11 = lVar11 + 1) {
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12b38,xpr,
               lVar11,0);
    pMStack_12160 = (XprTypeNested)sStack_12b18.m_other;
    pMStack_12158 = pMStack_12b10;
    pMStack_12180 = (RhsNested)auStack_12b38._0_8_;
    pMStack_12178 = (RhsNested)auStack_12b38._8_8_;
    pMStack_12170 = (XprTypeNested)sStack_12b28.m_other;
    pMStack_12168 = (XprTypeNested)sStack_12b20.m_other;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12be0,xpr,
               lVar11,0x40);
    sStack_12980.m_other = (double)vStack_12bc0.m_value;
    sStack_12978.m_other = (double)pMStack_12bb8;
    auStack_129a0._0_8_ = auStack_12be0._0_8_;
    auStack_129a0._8_8_ = auStack_12be0._8_8_;
    sStack_12990.m_other = sStack_12bd0.m_other;
    sStack_12988.m_other = (double)vStack_12bc8.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)&RStack_12c40,xpr,
               lVar11,0x80);
    LStack_10ef0.m_matrix = &local_fe80;
    vStack_10e40.m_value =
         RStack_12c40.m_matrix.
         super_BlockImpl<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_true>.
         m_startCol.m_value;
    IStack_10e38 = RStack_12c40.m_matrix.
                   super_BlockImpl<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_true>
                   .m_outerStride;
    vStack_10e60.m_value =
         (long)RStack_12c40.m_matrix.
               super_BlockImpl<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_Eigen::Dense>
               .
               super_BlockImpl_dense<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_true>
               .
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true>,_0>
               .m_data;
    vStack_10e58.m_value =
         RStack_12c40.m_matrix.
         super_BlockImpl<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true>,_0>.
         _8_8_;
    pMStack_10e50 =
         RStack_12c40.m_matrix.
         super_BlockImpl<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_true>.m_xpr
    ;
    sStack_10e48.m_other =
         (double)RStack_12c40.m_matrix.
                 super_BlockImpl<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_true>
                 .m_startRow.m_value;
    vStack_10ec8.m_value = (long)pMStack_12160;
    pMStack_10ec0 = pMStack_12158;
    LStack_10eb0.m_matrix = &MStack_11d40;
    vStack_10ee8.m_value = (long)pMStack_12180;
    vStack_10ee0.m_value = (long)pMStack_12178;
    pMStack_10ed8 = pMStack_12170;
    sStack_10ed0.m_other = (double)pMStack_12168;
    LStack_10e68.m_matrix = (non_const_type)auStack_11740;
    vStack_10e88.m_value = (long)sStack_12980.m_other;
    sStack_10e80.m_other = sStack_12978.m_other;
    sStack_10ea8.m_other = (double)auStack_129a0._0_8_;
    pMStack_10ea0 = (RhsNested)auStack_129a0._8_8_;
    pMStack_10e98 = (RhsNested)sStack_12990.m_other;
    vStack_10e90.m_value = (long)sStack_12988.m_other;
    Eigen::Block<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_64,_false> *)&BStack_12b68,
               &local_c680,lVar11,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,32,192,1,32,192>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,64,1,0,64,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,64,1,0,64,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,64,1,0,64,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const>const>>
              ((Block<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_64,_false> *)&BStack_12b68,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>_>_>
                *)auStack_10f00);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12b38,xpr,
               lVar11,0);
    pMStack_121a0 = (XprTypeNested)sStack_12b18.m_other;
    pMStack_12198 = pMStack_12b10;
    pMStack_121c0 = (RhsNested)auStack_12b38._0_8_;
    pMStack_121b8 = (RhsNested)auStack_12b38._8_8_;
    pMStack_121b0 = (XprTypeNested)sStack_12b28.m_other;
    pMStack_121a8 = (XprTypeNested)sStack_12b20.m_other;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12be0,xpr,
               lVar11,0x40);
    sStack_12980.m_other = (double)vStack_12bc0.m_value;
    sStack_12978.m_other = (double)pMStack_12bb8;
    auStack_129a0._0_8_ = auStack_12be0._0_8_;
    auStack_129a0._8_8_ = auStack_12be0._8_8_;
    sStack_12990.m_other = sStack_12bd0.m_other;
    sStack_12988.m_other = (double)vStack_12bc8.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)&RStack_12c40,xpr,
               lVar11,0x80);
    LStack_10ef0.m_matrix = &MStack_11d40;
    vStack_10e40.m_value =
         RStack_12c40.m_matrix.
         super_BlockImpl<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_true>.
         m_startCol.m_value;
    IStack_10e38 = RStack_12c40.m_matrix.
                   super_BlockImpl<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_true>
                   .m_outerStride;
    vStack_10e60.m_value =
         (long)RStack_12c40.m_matrix.
               super_BlockImpl<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_Eigen::Dense>
               .
               super_BlockImpl_dense<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_true>
               .
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true>,_0>
               .m_data;
    vStack_10e58.m_value =
         RStack_12c40.m_matrix.
         super_BlockImpl<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true>,_0>.
         _8_8_;
    pMStack_10e50 =
         RStack_12c40.m_matrix.
         super_BlockImpl<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_true>.m_xpr
    ;
    sStack_10e48.m_other =
         (double)RStack_12c40.m_matrix.
                 super_BlockImpl<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_true>
                 .m_startRow.m_value;
    vStack_10ec8.m_value = (long)pMStack_121a0;
    pMStack_10ec0 = pMStack_12198;
    LStack_10eb0.m_matrix = &MStack_11940;
    vStack_10ee8.m_value = (long)pMStack_121c0;
    vStack_10ee0.m_value = (long)pMStack_121b8;
    pMStack_10ed8 = pMStack_121b0;
    sStack_10ed0.m_other = (double)pMStack_121a8;
    LStack_10e68.m_matrix = &MStack_11500;
    vStack_10e88.m_value = (long)sStack_12980.m_other;
    sStack_10e80.m_other = sStack_12978.m_other;
    sStack_10ea8.m_other = (double)auStack_129a0._0_8_;
    pMStack_10ea0 = (RhsNested)auStack_129a0._8_8_;
    pMStack_10e98 = (RhsNested)sStack_12990.m_other;
    vStack_10e90.m_value = (long)sStack_12988.m_other;
    Eigen::Block<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_64,_false> *)&BStack_12b68,
               &local_c680,lVar11,0x40);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,32,192,1,32,192>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,64,1,0,64,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,64,1,0,64,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,64,1,0,64,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const>const>>
              ((Block<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_64,_false> *)&BStack_12b68,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>_>_>
                *)auStack_10f00);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12b38,xpr,
               lVar11,0);
    pMStack_121e0 = (XprTypeNested)sStack_12b18.m_other;
    pMStack_121d8 = pMStack_12b10;
    pMStack_12200 = (RhsNested)auStack_12b38._0_8_;
    pMStack_121f8 = (RhsNested)auStack_12b38._8_8_;
    pMStack_121f0 = (XprTypeNested)sStack_12b28.m_other;
    pMStack_121e8 = (XprTypeNested)sStack_12b20.m_other;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)auStack_12be0,xpr,
               lVar11,0x40);
    sStack_12980.m_other = (double)vStack_12bc0.m_value;
    sStack_12978.m_other = (double)pMStack_12bb8;
    auStack_129a0._0_8_ = auStack_12be0._0_8_;
    auStack_129a0._8_8_ = auStack_12be0._8_8_;
    sStack_12990.m_other = sStack_12bd0.m_other;
    sStack_12988.m_other = (double)vStack_12bc8.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false> *)&RStack_12c40,xpr,
               lVar11,0x80);
    LStack_10ef0.m_matrix = (non_const_type)auStack_11740;
    vStack_10e40.m_value =
         RStack_12c40.m_matrix.
         super_BlockImpl<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_true>.
         m_startCol.m_value;
    IStack_10e38 = RStack_12c40.m_matrix.
                   super_BlockImpl<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_true>
                   .m_outerStride;
    vStack_10e60.m_value =
         (long)RStack_12c40.m_matrix.
               super_BlockImpl<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_Eigen::Dense>
               .
               super_BlockImpl_dense<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_true>
               .
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true>,_0>
               .m_data;
    vStack_10e58.m_value =
         RStack_12c40.m_matrix.
         super_BlockImpl<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true>,_0>.
         _8_8_;
    pMStack_10e50 =
         RStack_12c40.m_matrix.
         super_BlockImpl<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_true>.m_xpr
    ;
    sStack_10e48.m_other =
         (double)RStack_12c40.m_matrix.
                 super_BlockImpl<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_true>
                 .m_startRow.m_value;
    vStack_10ec8.m_value = (long)pMStack_121e0;
    pMStack_10ec0 = pMStack_121d8;
    LStack_10eb0.m_matrix = &MStack_11500;
    vStack_10ee8.m_value = (long)pMStack_12200;
    vStack_10ee0.m_value = (long)pMStack_121f8;
    pMStack_10ed8 = pMStack_121f0;
    sStack_10ed0.m_other = (double)pMStack_121e8;
    LStack_10e68.m_matrix = &MStack_11b40;
    vStack_10e88.m_value = (long)sStack_12980.m_other;
    sStack_10e80.m_other = sStack_12978.m_other;
    sStack_10ea8.m_other = (double)auStack_129a0._0_8_;
    pMStack_10ea0 = (RhsNested)auStack_129a0._8_8_;
    pMStack_10e98 = (RhsNested)sStack_12990.m_other;
    vStack_10e90.m_value = (long)sStack_12988.m_other;
    Eigen::Block<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_64,_false>::Block
              ((Block<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_64,_false> *)&BStack_12b68,
               &local_c680,lVar11,0x80);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,32,192,1,32,192>,1,64,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,64,1,0,64,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,64,1,0,64,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,64,1,0,64,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,64,false>const>const>>
              ((Block<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_64,_false> *)&BStack_12b68,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_64,_1,_0,_64,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_64,_false>_>_>
                *)auStack_10f00);
  }
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_528,_1,_0,_528,_1>_>,_const_Eigen::Matrix<double,_528,_1,_0,_528,_1>_>
                    *)auStack_129a0,&dStack_129a8,(StorageBaseType *)&pCStack_12c68->m_MassMatrix);
  Eigen::PlainObjectBase<Eigen::Matrix<double,528,1,0,528,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,528,1,0,528,1>const>const,Eigen::Matrix<double,528,1,0,528,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,528,1,0,528,1>> *)auStack_10f00,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_528,_1,_0,_528,_1>_>,_const_Eigen::Matrix<double,_528,_1,_0,_528,_1>_>_>
              *)auStack_129a0);
  peStack_12c78 = (element_type *)0x0;
  pCStack_12c68 = (ChElementHexaANCF_3843 *)((ulong)pCStack_12c68 & 0xffffffff00000000);
  pdVar10 = (double *)0x0;
  while (pdVar10 != (double *)0x20) {
    pIStack_12c80 = (Index *)((long)pdVar10 * 3);
    pMStack_12bf8 = (non_const_type)((long)pdVar10 * 3 + 1);
    pIStack_12c00 = (Index *)((long)pdVar10 * 3 + 2);
    pdStack_12c70 = pdVar10;
    pdStack_12c08 = pdVar10;
    for (lVar11 = 0; lVar1 = (long)peStack_12c78 + lVar11, lVar1 != 0x60; lVar11 = lVar11 + 3) {
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true> *)auStack_12be0,xpr,
                 (Index)pdStack_12c08);
      Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>
                        *)auStack_12b38,&dStack_12be8,(StorageBaseType *)auStack_12be0);
      Eigen::Block<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true>::Block
                (&BStack_12b68,&local_c680,(Index)pdStack_12c70);
      RStack_12c40.m_matrix.
      super_BlockImpl<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_true>.
      m_startCol.m_value =
           BStack_12b68.
           super_BlockImpl<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_true>.
           m_startCol.m_value;
      RStack_12c40.m_matrix.
      super_BlockImpl<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_true>.
      m_outerStride =
           BStack_12b68.
           super_BlockImpl<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_true>.
           m_outerStride;
      RStack_12c40.m_matrix.
      super_BlockImpl<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true>,_0>.
      m_data = BStack_12b68.
               super_BlockImpl<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_Eigen::Dense>
               .
               super_BlockImpl_dense<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_true>
               .
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true>,_0>
               .m_data;
      RStack_12c40.m_matrix.
      super_BlockImpl<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true>,_0>._8_8_
           = BStack_12b68.
             super_BlockImpl<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_Eigen::Dense>
             .super_BlockImpl_dense<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true>,_0>
             ._8_8_;
      RStack_12c40.m_matrix.
      super_BlockImpl<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_true>.m_xpr =
           BStack_12b68.
           super_BlockImpl<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_true>.
           m_xpr;
      RStack_12c40.m_matrix.
      super_BlockImpl<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_true>.
      m_startRow.m_value =
           BStack_12b68.
           super_BlockImpl<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true,_true>.
           m_startRow.m_value;
      Eigen::
      Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>_>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true>_>,_0>
      ::Product((Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_32,_192,_1,_32,_192>,_1,_192,_true>_>,_0>
                 *)auStack_129a0,(Lhs *)auStack_12b38,&RStack_12c40);
      SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                         ((dense_product_base *)auStack_129a0);
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_528,_1,_0,_528,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_528,_1,_0,_528,_1>,_1> *)
                          auStack_10f00,(ulong)pCStack_12c68 & 0xffffffff);
      pDVar6 = pDStack_12bf0;
      dVar4 = SVar12 + *pSVar8;
      pSVar9 = Eigen::
               DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
               ::operator()(pDStack_12bf0,(Index)pIStack_12c80,lVar1);
      col = (long)peStack_12c78 + 1 + lVar11;
      *pSVar9 = dVar4 + *pSVar9;
      pSVar9 = Eigen::
               DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
               ::operator()(pDVar6,(Index)pMStack_12bf8,col);
      col_00 = (long)peStack_12c78 + 2 + lVar11;
      *pSVar9 = dVar4 + *pSVar9;
      pSVar9 = Eigen::
               DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
               ::operator()(pDVar6,(Index)pIStack_12c00,col_00);
      pDVar6 = pDStack_12bf0;
      *pSVar9 = dVar4 + *pSVar9;
      if (lVar11 != 0) {
        pSVar9 = Eigen::
                 DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                 ::operator()(pDStack_12bf0,lVar1,(Index)pIStack_12c80);
        *pSVar9 = dVar4 + *pSVar9;
        pSVar9 = Eigen::
                 DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                 ::operator()(pDVar6,col,(Index)pMStack_12bf8);
        *pSVar9 = dVar4 + *pSVar9;
        pSVar9 = Eigen::
                 DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                 ::operator()(pDVar6,col_00,(Index)pIStack_12c00);
        *pSVar9 = dVar4 + *pSVar9;
      }
      pCStack_12c68 = (ChElementHexaANCF_3843 *)CONCAT44(pCStack_12c68._4_4_,(int)pCStack_12c68 + 1)
      ;
      pdStack_12c70 = (double *)((long)pdStack_12c70 + 1);
    }
    peStack_12c78 = (element_type *)((long)peStack_12c78 + 3);
    pdVar10 = (double *)((long)pdStack_12c08 + 1);
  }
  Eigen::internal::handmade_aligned_free(PStack_12b80.m_storage.m_data);
  Eigen::internal::handmade_aligned_free(PStack_12ca0.m_storage.m_data);
  Eigen::internal::handmade_aligned_free(PStack_12c60.m_storage.m_data);
  return;
}

Assistant:

void ChElementHexaANCF_3843::ComputeInternalJacobianContIntDamping(ChMatrixRef& H,
                                                                   double Kfactor,
                                                                   double Rfactor,
                                                                   double Mfactor) {
    // Calculate the Jacobian of the generalize internal force vector using the "Continuous Integration" style of method
    // assuming a linear viscoelastic material model (single term damping model).  For this style of method, the
    // Jacobian of the generalized internal force vector is integrated across the volume of the element every time this
    // calculation is performed. For this element, this is likely more efficient than the "Pre-Integration" style
    // calculation method.

    MatrixNx6 ebar_ebardot;
    CalcCombinedCoordMatrix(ebar_ebardot);

    // No values from the generalized internal force vector are cached for reuse in the Jacobian.  Instead these
    // quantities are recalculated again during the Jacobian calculations.  This both simplifies the code and speeds
    // up the generalized internal force calculation while only having a minimal impact on the performance of the
    // Jacobian calculation speed.  The Jacobian calculation is performed in two major pieces.  First is the
    // calculation of the potentially non-symmetric and non-sparse component.  The second pieces is the symmetric
    // and sparse component.

    // =============================================================================
    // Calculate the deformation gradient and time derivative of the deformation gradient for all Gauss quadrature
    // points in a single matrix multiplication.  Note that since the shape function derivative matrix is ordered by
    // columns, the resulting deformation gradient will be ordered by block matrix (column vectors) components
    // Note that the indices of the components are in transposed order
    //      [F11  F21  F31  F11dot  F21dot  F31dot ]
    // FC = [F12  F22  F32  F12dot  F22dot  F32dot ]
    //      [F13  F23  F33  F13dot  F23dot  F33dot ]
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 6> FC = m_SD.transpose() * ebar_ebardot;

    //==============================================================================
    //==============================================================================
    // Calculate the potentially non-symmetric and non-sparse component of the Jacobian matrix
    //==============================================================================
    //==============================================================================

    // =============================================================================
    // Calculate the partial derivative of the Green-Largrange strains with respect to the nodal coordinates
    // (transposed).  This calculation is performed in blocks across all the Gauss quadrature points at the same
    // time.  This value should be store in row major memory layout to align with the access patterns for
    // calculating this matrix.
    // PE = [(d epsilon1/d e)GQPnt1' (d epsilon1/d e)GQPnt2' ... (d epsilon1/d e)GQPntNIP'...
    //       (d epsilon2/d e)GQPnt1' (d epsilon2/d e)GQPnt2' ... (d epsilon2/d e)GQPntNIP'...
    //       (d epsilon3/d e)GQPnt1' (d epsilon3/d e)GQPnt2' ... (d epsilon3/d e)GQPntNIP'...
    //       (d epsilon4/d e)GQPnt1' (d epsilon4/d e)GQPnt2' ... (d epsilon4/d e)GQPntNIP'...
    //       (d epsilon5/d e)GQPnt1' (d epsilon5/d e)GQPnt2' ... (d epsilon5/d e)GQPntNIP'...
    //       (d epsilon6/d e)GQPnt1' (d epsilon6/d e)GQPnt2' ... (d epsilon6/d e)GQPntNIP']
    // Note that each partial derivative block shown is placed to the left of the previous block.
    // The explanation of the calculation above is just too long to write it all on a single line.
    // =============================================================================

    Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor> PE;
    PE.resize(3 * NSF, 6 * NIP);

    for (auto i = 0; i < NSF; i++) {
        PE.block<1, NIP>(3 * i, 0 * NIP) =
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FC.template block<NIP, 1>(0 * NIP, 0).transpose());
        PE.block<1, NIP>(3 * i, 1 * NIP) =
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FC.template block<NIP, 1>(1 * NIP, 0).transpose());
        PE.block<1, NIP>(3 * i, 2 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0).transpose());
        PE.block<1, NIP>(3 * i, 3 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FC.template block<NIP, 1>(1 * NIP, 0).transpose()) +
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0).transpose());
        PE.block<1, NIP>(3 * i, 4 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FC.template block<NIP, 1>(0 * NIP, 0).transpose()) +
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0).transpose());
        PE.block<1, NIP>(3 * i, 5 * NIP) =
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FC.template block<NIP, 1>(0 * NIP, 0).transpose()) +
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FC.template block<NIP, 1>(1 * NIP, 0).transpose());

        PE.block<1, NIP>((3 * i) + 1, 0) =
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 1).transpose());
        PE.block<1, NIP>((3 * i) + 1, NIP) =
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 1).transpose());
        PE.block<1, NIP>((3 * i) + 1, 2 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1).transpose());
        PE.block<1, NIP>((3 * i) + 1, 3 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 1).transpose()) +
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1).transpose());
        PE.block<1, NIP>((3 * i) + 1, 4 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 1).transpose()) +
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1).transpose());
        PE.block<1, NIP>((3 * i) + 1, 5 * NIP) =
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 1).transpose()) +
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 1).transpose());

        PE.block<1, NIP>((3 * i) + 2, 0) =
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 2).transpose());
        PE.block<1, NIP>((3 * i) + 2, NIP) =
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 2).transpose());
        PE.block<1, NIP>((3 * i) + 2, 2 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2).transpose());
        PE.block<1, NIP>((3 * i) + 2, 3 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 2).transpose()) +
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2).transpose());
        PE.block<1, NIP>((3 * i) + 2, 4 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 2).transpose()) +
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2).transpose());
        PE.block<1, NIP>((3 * i) + 2, 5 * NIP) =
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 2).transpose()) +
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 2).transpose());
    }

    // =============================================================================
    // Combine the deformation gradient, time derivative of the deformation gradient, damping coefficient, Gauss
    // quadrature weighting times the element Jacobian, and Jacobian component scale factors into a scaled block
    // deformation gradient matrix Calculate the deformation gradient and time derivative of the deformation
    // gradient for all Gauss quadrature points in a single matrix multiplication.  Note that the resulting combined
    // deformation gradient block matrix will be ordered by block matrix (column vectors) components Note that the
    // indices of the components are in transposed order
    //            [kGQ*(Kfactor+alpha*Rfactor)*F11+alpha*Rfactor*F11dot ... similar for F21 & F31 blocks]
    // FCscaled = [kGQ*(Kfactor+alpha*Rfactor)*F12+alpha*Rfactor*F12dot ... similar for F22 & F32 blocks]
    //            [kGQ*(Kfactor+alpha*Rfactor)*F13+alpha*Rfactor*F13dot ... similar for F23 & F33 blocks]
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 3> FCscaled = (Kfactor + m_Alpha * Rfactor) * FC.template block<3 * NIP, 3>(0, 0) +
                                               (m_Alpha * Kfactor) * FC.template block<3 * NIP, 3>(0, 3);

    for (auto i = 0; i < 3; i++) {
        FCscaled.template block<NIP, 1>(0, i).array() *= m_kGQ.array();
        FCscaled.template block<NIP, 1>(NIP, i).array() *= m_kGQ.array();
        FCscaled.template block<NIP, 1>(2 * NIP, i).array() *= m_kGQ.array();
    }

    // =============================================================================
    // Calculate the combination of the scaled partial derivative of the Green-Largrange strains with respect to the
    // nodal coordinates, the scaled partial derivative of the time derivative of the Green-Largrange strains with
    // respect to the nodal coordinates, the scaled partial derivative of the Green-Largrange strains with respect
    // to the time derivative of the nodal coordinates, and the other parameters to correctly integrate across the
    // volume of the element.  This calculation is performed in blocks across all the Gauss quadrature points at the
    // same time.  This value should be store in row major memory layout to align with the access patterns for
    // calculating this matrix.
    // =============================================================================

    Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor> Scaled_Combined_PE;
    Scaled_Combined_PE.resize(3 * NSF, 6 * NIP);

    for (auto i = 0; i < NSF; i++) {
        Scaled_Combined_PE.block<1, NIP>(3 * i, 0) =
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(0, 0).transpose());
        Scaled_Combined_PE.block<1, NIP>(3 * i, NIP) =
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 0).transpose());
        Scaled_Combined_PE.block<1, NIP>(3 * i, 2 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 0).transpose());
        Scaled_Combined_PE.block<1, NIP>(3 * i, 3 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 0).transpose()) +
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 0).transpose());
        Scaled_Combined_PE.block<1, NIP>(3 * i, 4 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(0, 0).transpose()) +
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 0).transpose());
        Scaled_Combined_PE.block<1, NIP>(3 * i, 5 * NIP) =
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(0, 0).transpose()) +
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 0).transpose());

        Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 0) =
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(0, 1).transpose());
        Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, NIP) =
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 1).transpose());
        Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 2 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 1).transpose());
        Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 3 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 1).transpose()) +
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 1).transpose());
        Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 4 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(0, 1).transpose()) +
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 1).transpose());
        Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 5 * NIP) =
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(0, 1).transpose()) +
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 1).transpose());

        Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 0) =
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(0, 2).transpose());
        Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, NIP) =
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 2).transpose());
        Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 2 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 2).transpose());
        Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 3 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 2).transpose()) +
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 2).transpose());
        Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 4 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(0, 2).transpose()) +
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 2).transpose());
        Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 5 * NIP) =
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(0, 2).transpose()) +
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 2).transpose());
    }

    // =============================================================================
    // Get the stiffness tensor in 6x6 matrix form
    // =============================================================================

    const ChMatrixNM<double, 6, 6>& D = GetMaterial()->Get_D();

    // =============================================================================
    // Multiply the scaled and combined partial derivative block matrix by the stiffness matrix for each individual
    // Gauss quadrature point
    // =============================================================================

    Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor> DScaled_Combined_PE;
    DScaled_Combined_PE.resize(3 * NSF, 6 * NIP);

    DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 0) =
        D(0, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
        D(0, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
        D(0, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
        D(0, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
        D(0, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
        D(0, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
    DScaled_Combined_PE.template block<3 * NSF, NIP>(0, NIP) =
        D(1, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
        D(1, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
        D(1, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
        D(1, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
        D(1, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
        D(1, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
    DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 2 * NIP) =
        D(2, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
        D(2, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
        D(2, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
        D(2, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
        D(2, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
        D(2, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
    DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 3 * NIP) =
        D(3, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
        D(3, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
        D(3, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
        D(3, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
        D(3, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
        D(3, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
    DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 4 * NIP) =
        D(4, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
        D(4, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
        D(4, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
        D(4, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
        D(4, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
        D(4, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
    DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 5 * NIP) =
        D(5, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
        D(5, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
        D(5, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
        D(5, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
        D(5, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
        D(5, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);

    // =============================================================================
    // Multiply the partial derivative block matrix by the final scaled and combined partial derivative block matrix
    // to obtain the potentially non-symmetric and non-sparse component of the Jacobian matrix
    // =============================================================================

    H = PE * DScaled_Combined_PE.transpose();

    //==============================================================================
    //==============================================================================
    // Calculate the sparse and symmetric component of the Jacobian matrix
    //==============================================================================
    //==============================================================================

    // =============================================================================
    // Calculate each individual value of the Green-Lagrange strain component by component across all the
    // Gauss-Quadrature points at a time to better leverage vectorized CPU instructions.
    // Note that the scaled time derivatives of the Green-Lagrange strain are added to make the later calculation of
    // the 2nd Piola-Kirchoff stresses more efficient.  The combined result is then scaled by minus the Gauss
    // quadrature weight times the element Jacobian at the corresponding Gauss point (m_kGQ) again for efficiency.
    // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
    // =============================================================================

    // Each entry in E1 = kGQ*(E11+alpha*E11dot)
    //                  = kGQ*(1/2*(F11*F11+F21*F21+F31*F31-1)+alpha*(F11*F11dot+F21*F21dot+F31*F31dot))
    VectorNIP E_BlockDamping = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                               FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                               FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5));
    VectorNIP E1_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(0, 0)) +
                         FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(0, 1)) +
                         FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(0, 2));
    E1_Block.array() -= 1;
    E1_Block *= 0.5;
    E1_Block += m_Alpha * E_BlockDamping;
    E1_Block.array() *= m_kGQ.array();

    // Each entry in E2 = kGQ*(E22+alpha*E22dot)
    //                  = kGQ*(1/2*(F12*F12+F22*F22+F32*F32-1)+alpha*(F12*F12dot+F22*F22dot+F32*F32dot))
    E_BlockDamping.noalias() = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
                               FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
                               FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5));
    VectorNIP E2_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                         FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                         FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
    E2_Block.array() -= 1;
    E2_Block *= 0.5;
    E2_Block += m_Alpha * E_BlockDamping;
    E2_Block.array() *= m_kGQ.array();

    // Each entry in E3 = kGQ*(E33+alpha*E33dot)
    //                  = kGQ*(1/2*(F13*F13+F23*F23+F33*F33-1)+alpha*(F13*F13dot+F23*F23dot+F33*F33dot))
    E_BlockDamping.noalias() =
        FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
        FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
        FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
    VectorNIP E3_Block = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                         FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                         FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
    E3_Block.array() -= 1;
    E3_Block *= 0.5;
    E3_Block += m_Alpha * E_BlockDamping;
    E3_Block.array() *= m_kGQ.array();

    // Each entry in E4 = kGQ*(2*(E23+alpha*E23dot))
    //                  = kGQ*((F12*F13+F22*F23+F32*F33)
    //                    +alpha*(F12dot*F13+F22dot*F23+F32dot*F33 + F12*F13dot+F22*F23dot+F32*F33dot))
    E_BlockDamping.noalias() = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
                               FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
                               FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5)) +
                               FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
                               FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
                               FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
    VectorNIP E4_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                         FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                         FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
    E4_Block += m_Alpha * E_BlockDamping;
    E4_Block.array() *= m_kGQ.array();

    // Each entry in E5 = kGQ*(2*(E13+alpha*E13dot))
    //                  = kGQ*((F11*F13+F21*F23+F31*F33)
    //                    +alpha*(F11dot*F13+F21dot*F23+F31dot*F33 + F11*F13dot+F21*F23dot+F31*F33dot))
    E_BlockDamping.noalias() = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                               FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                               FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5)) +
                               FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
                               FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
                               FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
    VectorNIP E5_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                         FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                         FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
    E5_Block += m_Alpha * E_BlockDamping;
    E5_Block.array() *= m_kGQ.array();

    // Each entry in E6 = kGQ*(2*(E12+alpha*E12dot))
    //                  = kGQ*((F11*F12+F21*F22+F31*F32)
    //                    +alpha*(F11dot*F12+F21dot*F22+F31dot*F32 + F11*F12dot+F21*F22dot+F31*F32dot))
    E_BlockDamping.noalias() = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                               FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                               FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5)) +
                               FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
                               FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
                               FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5));
    VectorNIP E6_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                         FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                         FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
    E6_Block += m_Alpha * E_BlockDamping;
    E6_Block.array() *= m_kGQ.array();

    // =============================================================================
    // Calculate the 2nd Piola-Kirchoff stresses in Voigt notation across all the Gauss quadrature points at a time
    // component by component. Note that the Green-Largrange strain components have been scaled and already been
    // combined with their scaled time derivatives and minus the Gauss quadrature weight times the element Jacobian at
    // the corresponding Gauss point to make the calculation of the 2nd Piola-Kirchoff stresses more efficient.
    //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
    // =============================================================================

    VectorNIP SPK2_1_Block = D(0, 0) * E1_Block + D(0, 1) * E2_Block + D(0, 2) * E3_Block + D(0, 3) * E4_Block +
                             D(0, 4) * E5_Block + D(0, 5) * E6_Block;
    VectorNIP SPK2_2_Block = D(1, 0) * E1_Block + D(1, 1) * E2_Block + D(1, 2) * E3_Block + D(1, 3) * E4_Block +
                             D(1, 4) * E5_Block + D(1, 5) * E6_Block;
    VectorNIP SPK2_3_Block = D(2, 0) * E1_Block + D(2, 1) * E2_Block + D(2, 2) * E3_Block + D(2, 3) * E4_Block +
                             D(2, 4) * E5_Block + D(2, 5) * E6_Block;
    VectorNIP SPK2_4_Block = D(3, 0) * E1_Block + D(3, 1) * E2_Block + D(3, 2) * E3_Block + D(3, 3) * E4_Block +
                             D(3, 4) * E5_Block + D(3, 5) * E6_Block;
    VectorNIP SPK2_5_Block = D(4, 0) * E1_Block + D(4, 1) * E2_Block + D(4, 2) * E3_Block + D(4, 3) * E4_Block +
                             D(4, 4) * E5_Block + D(4, 5) * E6_Block;
    VectorNIP SPK2_6_Block = D(5, 0) * E1_Block + D(5, 1) * E2_Block + D(5, 2) * E3_Block + D(5, 3) * E4_Block +
                             D(5, 4) * E5_Block + D(5, 5) * E6_Block;

    // =============================================================================
    // Multiply the shape function derivative matrix by the 2nd Piola-Kirchoff stresses for each corresponding Gauss
    // quadrature point
    // =============================================================================

    ChMatrixNM<double, NSF, 3 * NIP> S_scaled_SD;

    for (auto i = 0; i < NSF; i++) {
        S_scaled_SD.template block<1, NIP>(i, 0) =
            SPK2_1_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, 0 * NIP)) +
            SPK2_6_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, 1 * NIP)) +
            SPK2_5_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, 2 * NIP));

        S_scaled_SD.template block<1, NIP>(i, NIP) =
            SPK2_6_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, 0 * NIP)) +
            SPK2_2_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, 1 * NIP)) +
            SPK2_4_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, 2 * NIP));

        S_scaled_SD.template block<1, NIP>(i, 2 * NIP) =
            SPK2_5_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, 0 * NIP)) +
            SPK2_4_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, 1 * NIP)) +
            SPK2_3_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, 2 * NIP));
    }

    // =============================================================================
    // Calculate just the non-sparse upper triangular entires of the sparse and symmetric component of the Jacobian
    // matrix, combine this with the scaled mass matrix, and then expand them out to full size by summing the
    // contribution into the correct locations of the full sized Jacobian matrix
    // =============================================================================

    // Add in the Mass Matrix Which is Stored in Compact Upper Triangular Form
    ChVectorN<double, (NSF * (NSF + 1)) / 2> ScaledMassMatrix = Mfactor * m_MassMatrix;

    unsigned int idx = 0;
    for (unsigned int i = 0; i < NSF; i++) {
        for (unsigned int j = i; j < NSF; j++) {
            double d = Kfactor * m_SD.row(i) * S_scaled_SD.row(j).transpose();
            d += ScaledMassMatrix(idx);

            H(3 * i, 3 * j) += d;
            H(3 * i + 1, 3 * j + 1) += d;
            H(3 * i + 2, 3 * j + 2) += d;
            if (i != j) {
                H(3 * j, 3 * i) += d;
                H(3 * j + 1, 3 * i + 1) += d;
                H(3 * j + 2, 3 * i + 2) += d;
            }
            idx++;
        }
    }
}